

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  undefined4 uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  code *pcVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  long lVar69;
  int iVar70;
  undefined1 auVar71 [32];
  byte bVar72;
  ulong uVar73;
  uint uVar74;
  uint uVar75;
  ulong uVar76;
  int iVar77;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  long lVar78;
  uint uVar79;
  ulong uVar80;
  size_t sVar81;
  byte bVar82;
  ulong uVar83;
  float fVar84;
  float fVar85;
  float fVar135;
  float fVar136;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar90 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar91 [16];
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar92 [16];
  float fVar138;
  float fVar141;
  float fVar142;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar143;
  undefined4 uVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar158;
  float fVar159;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined8 uVar160;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar164 [16];
  float fVar163;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar173;
  float fVar178;
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_600 [16];
  int local_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  size_t local_548;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  int local_450;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar209 [32];
  
  PVar11 = prim[1];
  uVar83 = (ulong)(byte)PVar11;
  lVar69 = uVar83 * 0x19;
  fVar163 = *(float *)(prim + lVar69 + 0x12);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar90 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar164 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + lVar69 + 6));
  fVar172 = fVar163 * auVar164._0_4_;
  fVar143 = fVar163 * auVar90._0_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar86);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar89);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar108 = vpmovsxbd_avx2(auVar88);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar107 = vpmovsxbd_avx2(auVar87);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar101 = vpmovsxbd_avx2(auVar6);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar99 = vcvtdq2ps_avx(auVar101);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar83 + 6);
  auVar97 = vpmovsxbd_avx2(auVar7);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar80 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar106 = vpmovsxbd_avx2(auVar8);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar80 + uVar83 + 6);
  auVar105 = vpmovsxbd_avx2(auVar9);
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar73 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar95 = vpmovsxbd_avx2(auVar10);
  auVar100 = vcvtdq2ps_avx(auVar95);
  auVar205._4_4_ = fVar143;
  auVar205._0_4_ = fVar143;
  auVar205._8_4_ = fVar143;
  auVar205._12_4_ = fVar143;
  auVar205._16_4_ = fVar143;
  auVar205._20_4_ = fVar143;
  auVar205._24_4_ = fVar143;
  auVar205._28_4_ = fVar143;
  auVar207._8_4_ = 1;
  auVar207._0_8_ = 0x100000001;
  auVar207._12_4_ = 1;
  auVar207._16_4_ = 1;
  auVar207._20_4_ = 1;
  auVar207._24_4_ = 1;
  auVar207._28_4_ = 1;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar214 = ZEXT3264(auVar93);
  auVar103 = ZEXT1632(CONCAT412(fVar163 * auVar90._12_4_,
                                CONCAT48(fVar163 * auVar90._8_4_,
                                         CONCAT44(fVar163 * auVar90._4_4_,fVar143))));
  auVar102 = vpermps_avx2(auVar207,auVar103);
  auVar94 = vpermps_avx512vl(auVar93,auVar103);
  fVar143 = auVar94._0_4_;
  fVar158 = auVar94._4_4_;
  auVar103._4_4_ = fVar158 * auVar108._4_4_;
  auVar103._0_4_ = fVar143 * auVar108._0_4_;
  fVar159 = auVar94._8_4_;
  auVar103._8_4_ = fVar159 * auVar108._8_4_;
  fVar173 = auVar94._12_4_;
  auVar103._12_4_ = fVar173 * auVar108._12_4_;
  fVar178 = auVar94._16_4_;
  auVar103._16_4_ = fVar178 * auVar108._16_4_;
  fVar84 = auVar94._20_4_;
  auVar103._20_4_ = fVar84 * auVar108._20_4_;
  fVar85 = auVar94._24_4_;
  auVar103._24_4_ = fVar85 * auVar108._24_4_;
  auVar103._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar97._4_4_ * fVar158;
  auVar101._0_4_ = auVar97._0_4_ * fVar143;
  auVar101._8_4_ = auVar97._8_4_ * fVar159;
  auVar101._12_4_ = auVar97._12_4_ * fVar173;
  auVar101._16_4_ = auVar97._16_4_ * fVar178;
  auVar101._20_4_ = auVar97._20_4_ * fVar84;
  auVar101._24_4_ = auVar97._24_4_ * fVar85;
  auVar101._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar100._4_4_ * fVar158;
  auVar95._0_4_ = auVar100._0_4_ * fVar143;
  auVar95._8_4_ = auVar100._8_4_ * fVar159;
  auVar95._12_4_ = auVar100._12_4_ * fVar173;
  auVar95._16_4_ = auVar100._16_4_ * fVar178;
  auVar95._20_4_ = auVar100._20_4_ * fVar84;
  auVar95._24_4_ = auVar100._24_4_ * fVar85;
  auVar95._28_4_ = auVar94._28_4_;
  auVar86 = vfmadd231ps_fma(auVar103,auVar102,auVar96);
  auVar89 = vfmadd231ps_fma(auVar101,auVar102,auVar99);
  auVar88 = vfmadd231ps_fma(auVar95,auVar105,auVar102);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar205,auVar98);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar205,auVar107);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar106,auVar205);
  auVar206._4_4_ = fVar172;
  auVar206._0_4_ = fVar172;
  auVar206._8_4_ = fVar172;
  auVar206._12_4_ = fVar172;
  auVar206._16_4_ = fVar172;
  auVar206._20_4_ = fVar172;
  auVar206._24_4_ = fVar172;
  auVar206._28_4_ = fVar172;
  auVar95 = ZEXT1632(CONCAT412(fVar163 * auVar164._12_4_,
                               CONCAT48(fVar163 * auVar164._8_4_,
                                        CONCAT44(fVar163 * auVar164._4_4_,fVar172))));
  auVar101 = vpermps_avx2(auVar207,auVar95);
  auVar95 = vpermps_avx512vl(auVar93,auVar95);
  fVar163 = auVar95._0_4_;
  fVar143 = auVar95._4_4_;
  auVar102._4_4_ = fVar143 * auVar108._4_4_;
  auVar102._0_4_ = fVar163 * auVar108._0_4_;
  fVar158 = auVar95._8_4_;
  auVar102._8_4_ = fVar158 * auVar108._8_4_;
  fVar159 = auVar95._12_4_;
  auVar102._12_4_ = fVar159 * auVar108._12_4_;
  fVar173 = auVar95._16_4_;
  auVar102._16_4_ = fVar173 * auVar108._16_4_;
  fVar178 = auVar95._20_4_;
  auVar102._20_4_ = fVar178 * auVar108._20_4_;
  fVar84 = auVar95._24_4_;
  auVar102._24_4_ = fVar84 * auVar108._24_4_;
  auVar102._28_4_ = 1;
  auVar93._4_4_ = auVar97._4_4_ * fVar143;
  auVar93._0_4_ = auVar97._0_4_ * fVar163;
  auVar93._8_4_ = auVar97._8_4_ * fVar158;
  auVar93._12_4_ = auVar97._12_4_ * fVar159;
  auVar93._16_4_ = auVar97._16_4_ * fVar173;
  auVar93._20_4_ = auVar97._20_4_ * fVar178;
  auVar93._24_4_ = auVar97._24_4_ * fVar84;
  auVar93._28_4_ = auVar108._28_4_;
  auVar97._4_4_ = auVar100._4_4_ * fVar143;
  auVar97._0_4_ = auVar100._0_4_ * fVar163;
  auVar97._8_4_ = auVar100._8_4_ * fVar158;
  auVar97._12_4_ = auVar100._12_4_ * fVar159;
  auVar97._16_4_ = auVar100._16_4_ * fVar173;
  auVar97._20_4_ = auVar100._20_4_ * fVar178;
  auVar97._24_4_ = auVar100._24_4_ * fVar84;
  auVar97._28_4_ = auVar95._28_4_;
  auVar87 = vfmadd231ps_fma(auVar102,auVar101,auVar96);
  auVar6 = vfmadd231ps_fma(auVar93,auVar101,auVar99);
  auVar7 = vfmadd231ps_fma(auVar97,auVar101,auVar105);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar206,auVar98);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar206,auVar107);
  auVar195._8_4_ = 0x7fffffff;
  auVar195._0_8_ = 0x7fffffff7fffffff;
  auVar195._12_4_ = 0x7fffffff;
  auVar195._16_4_ = 0x7fffffff;
  auVar195._20_4_ = 0x7fffffff;
  auVar195._24_4_ = 0x7fffffff;
  auVar195._28_4_ = 0x7fffffff;
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar206,auVar106);
  auVar98 = vandps_avx(ZEXT1632(auVar86),auVar195);
  auVar193._8_4_ = 0x219392ef;
  auVar193._0_8_ = 0x219392ef219392ef;
  auVar193._12_4_ = 0x219392ef;
  auVar193._16_4_ = 0x219392ef;
  auVar193._20_4_ = 0x219392ef;
  auVar193._24_4_ = 0x219392ef;
  auVar193._28_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar98,auVar193,1);
  bVar16 = (bool)((byte)uVar80 & 1);
  auVar94._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar86._0_4_;
  bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar86._4_4_;
  bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar86._8_4_;
  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar86._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar89),auVar195);
  uVar80 = vcmpps_avx512vl(auVar98,auVar193,1);
  bVar16 = (bool)((byte)uVar80 & 1);
  auVar104._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar89._0_4_;
  bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar89._4_4_;
  bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar89._8_4_;
  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar89._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar88),auVar195);
  uVar80 = vcmpps_avx512vl(auVar98,auVar193,1);
  bVar16 = (bool)((byte)uVar80 & 1);
  auVar98._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar88._0_4_;
  bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar88._4_4_;
  bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar88._8_4_;
  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar88._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar194._8_4_ = 0x3f800000;
  auVar194._0_8_ = 0x3f8000003f800000;
  auVar194._12_4_ = 0x3f800000;
  auVar194._16_4_ = 0x3f800000;
  auVar194._20_4_ = 0x3f800000;
  auVar194._24_4_ = 0x3f800000;
  auVar194._28_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar94,auVar96,auVar194);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar104);
  auVar89 = vfnmadd213ps_fma(auVar104,auVar96,auVar194);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar98);
  auVar88 = vfnmadd213ps_fma(auVar98,auVar96,auVar194);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar96,auVar96);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar87));
  auVar106._4_4_ = auVar86._4_4_ * auVar98._4_4_;
  auVar106._0_4_ = auVar86._0_4_ * auVar98._0_4_;
  auVar106._8_4_ = auVar86._8_4_ * auVar98._8_4_;
  auVar106._12_4_ = auVar86._12_4_ * auVar98._12_4_;
  auVar106._16_4_ = auVar98._16_4_ * 0.0;
  auVar106._20_4_ = auVar98._20_4_ * 0.0;
  auVar106._24_4_ = auVar98._24_4_ * 0.0;
  auVar106._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar87));
  auVar97 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar169._0_4_ = auVar86._0_4_ * auVar98._0_4_;
  auVar169._4_4_ = auVar86._4_4_ * auVar98._4_4_;
  auVar169._8_4_ = auVar86._8_4_ * auVar98._8_4_;
  auVar169._12_4_ = auVar86._12_4_ * auVar98._12_4_;
  auVar169._16_4_ = auVar98._16_4_ * 0.0;
  auVar169._20_4_ = auVar98._20_4_ * 0.0;
  auVar169._24_4_ = auVar98._24_4_ * 0.0;
  auVar169._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar11 * 0x10 + uVar83 * -2 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar6));
  auVar105._4_4_ = auVar89._4_4_ * auVar98._4_4_;
  auVar105._0_4_ = auVar89._0_4_ * auVar98._0_4_;
  auVar105._8_4_ = auVar89._8_4_ * auVar98._8_4_;
  auVar105._12_4_ = auVar89._12_4_ * auVar98._12_4_;
  auVar105._16_4_ = auVar98._16_4_ * 0.0;
  auVar105._20_4_ = auVar98._20_4_ * 0.0;
  auVar105._24_4_ = auVar98._24_4_ * 0.0;
  auVar105._28_4_ = auVar98._28_4_;
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar6));
  auVar161._0_4_ = auVar89._0_4_ * auVar98._0_4_;
  auVar161._4_4_ = auVar89._4_4_ * auVar98._4_4_;
  auVar161._8_4_ = auVar89._8_4_ * auVar98._8_4_;
  auVar161._12_4_ = auVar89._12_4_ * auVar98._12_4_;
  auVar161._16_4_ = auVar98._16_4_ * 0.0;
  auVar161._20_4_ = auVar98._20_4_ * 0.0;
  auVar161._24_4_ = auVar98._24_4_ * 0.0;
  auVar161._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar83 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar7));
  auVar100._4_4_ = auVar98._4_4_ * auVar88._4_4_;
  auVar100._0_4_ = auVar98._0_4_ * auVar88._0_4_;
  auVar100._8_4_ = auVar98._8_4_ * auVar88._8_4_;
  auVar100._12_4_ = auVar98._12_4_ * auVar88._12_4_;
  auVar100._16_4_ = auVar98._16_4_ * 0.0;
  auVar100._20_4_ = auVar98._20_4_ * 0.0;
  auVar100._24_4_ = auVar98._24_4_ * 0.0;
  auVar100._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar7));
  auVar109._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar109._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar109._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar109._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar109._16_4_ = auVar98._16_4_ * 0.0;
  auVar109._20_4_ = auVar98._20_4_ * 0.0;
  auVar109._24_4_ = auVar98._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar106,auVar169);
  auVar96 = vpminsd_avx2(auVar105,auVar161);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar100,auVar109);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar108._4_4_ = uVar3;
  auVar108._0_4_ = uVar3;
  auVar108._8_4_ = uVar3;
  auVar108._12_4_ = uVar3;
  auVar108._16_4_ = uVar3;
  auVar108._20_4_ = uVar3;
  auVar108._24_4_ = uVar3;
  auVar108._28_4_ = uVar3;
  auVar96 = vmaxps_avx512vl(auVar96,auVar108);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar106,auVar169);
  auVar96 = vpmaxsd_avx2(auVar105,auVar161);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar100,auVar109);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar107._4_4_ = uVar3;
  auVar107._0_4_ = uVar3;
  auVar107._8_4_ = uVar3;
  auVar107._12_4_ = uVar3;
  auVar107._16_4_ = uVar3;
  auVar107._20_4_ = uVar3;
  auVar107._24_4_ = uVar3;
  auVar107._28_4_ = uVar3;
  auVar96 = vminps_avx512vl(auVar96,auVar107);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar99);
  uVar22 = vpcmpgtd_avx512vl(auVar97,_DAT_01fe9900);
  uVar160 = vcmpps_avx512vl(local_80,auVar98,2);
  if ((byte)((byte)uVar160 & (byte)uVar22) != 0) {
    uVar80 = (ulong)(byte)((byte)uVar160 & (byte)uVar22);
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar215 = ZEXT1664(auVar86);
    auVar216 = ZEXT464(0x35000000);
    local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    sVar81 = k;
    local_548 = k;
    do {
      lVar23 = 0;
      for (uVar73 = uVar80; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar80 = uVar80 - 1 & uVar80;
      uVar3 = *(undefined4 *)(prim + lVar23 * 4 + 6);
      uVar73 = (ulong)(uint)((int)lVar23 << 6);
      uVar79 = *(uint *)(prim + 2);
      pGVar13 = (context->scene->geometries).items[uVar79].ptr;
      local_5d0 = *(undefined1 (*) [16])(prim + uVar73 + lVar69 + 0x16);
      if (uVar80 != 0) {
        uVar76 = uVar80 - 1 & uVar80;
        for (uVar83 = uVar80; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        }
        if (uVar76 != 0) {
          for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_5a0 = *(undefined1 (*) [16])(prim + uVar73 + lVar69 + 0x26);
      local_5b0 = *(undefined1 (*) [16])(prim + uVar73 + lVar69 + 0x36);
      _local_5c0 = *(undefined1 (*) [16])(prim + uVar73 + lVar69 + 0x46);
      iVar77 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar81 * 4)),
                              ZEXT416(*(uint *)(ray + sVar81 * 4 + 0x10)),0x1c);
      auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + sVar81 * 4 + 0x20)),0x28);
      auVar88 = vsubps_avx(local_5d0,auVar86);
      uVar144 = auVar88._0_4_;
      auVar90._4_4_ = uVar144;
      auVar90._0_4_ = uVar144;
      auVar90._8_4_ = uVar144;
      auVar90._12_4_ = uVar144;
      auVar89 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar163 = pre->ray_space[k].vz.field_0.m128[0];
      fVar143 = pre->ray_space[k].vz.field_0.m128[1];
      fVar158 = pre->ray_space[k].vz.field_0.m128[2];
      fVar159 = pre->ray_space[k].vz.field_0.m128[3];
      auVar92._0_4_ = fVar163 * auVar88._0_4_;
      auVar92._4_4_ = fVar143 * auVar88._4_4_;
      auVar92._8_4_ = fVar158 * auVar88._8_4_;
      auVar92._12_4_ = fVar159 * auVar88._12_4_;
      auVar89 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar5,auVar89);
      auVar6 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar90);
      auVar89 = vshufps_avx(local_5d0,local_5d0,0xff);
      auVar87 = vsubps_avx(local_5a0,auVar86);
      uVar144 = auVar87._0_4_;
      auVar174._4_4_ = uVar144;
      auVar174._0_4_ = uVar144;
      auVar174._8_4_ = uVar144;
      auVar174._12_4_ = uVar144;
      auVar88 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar198._0_4_ = fVar163 * auVar87._0_4_;
      auVar198._4_4_ = fVar143 * auVar87._4_4_;
      auVar198._8_4_ = fVar158 * auVar87._8_4_;
      auVar198._12_4_ = fVar159 * auVar87._12_4_;
      auVar88 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar88);
      auVar7 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar4,auVar174);
      auVar87 = vsubps_avx512vl(local_5b0,auVar86);
      uVar144 = auVar87._0_4_;
      auVar91._4_4_ = uVar144;
      auVar91._0_4_ = uVar144;
      auVar91._8_4_ = uVar144;
      auVar91._12_4_ = uVar144;
      auVar88 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar201._0_4_ = fVar163 * auVar87._0_4_;
      auVar201._4_4_ = fVar143 * auVar87._4_4_;
      auVar201._8_4_ = fVar158 * auVar87._8_4_;
      auVar201._12_4_ = fVar159 * auVar87._12_4_;
      auVar88 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar5,auVar88);
      auVar87 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar4,auVar91);
      auVar88 = vsubps_avx512vl(_local_5c0,auVar86);
      uVar144 = auVar88._0_4_;
      auVar164._4_4_ = uVar144;
      auVar164._0_4_ = uVar144;
      auVar164._8_4_ = uVar144;
      auVar164._12_4_ = uVar144;
      auVar86 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar202._0_4_ = fVar163 * auVar88._0_4_;
      auVar202._4_4_ = fVar143 * auVar88._4_4_;
      auVar202._8_4_ = fVar158 * auVar88._8_4_;
      auVar202._12_4_ = fVar159 * auVar88._12_4_;
      auVar86 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar86);
      auVar88 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar164);
      lVar23 = (long)iVar77 * 0x44;
      auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar23);
      uVar144 = auVar6._0_4_;
      local_2e0._4_4_ = uVar144;
      local_2e0._0_4_ = uVar144;
      local_2e0._8_4_ = uVar144;
      local_2e0._12_4_ = uVar144;
      local_2e0._16_4_ = uVar144;
      local_2e0._20_4_ = uVar144;
      local_2e0._24_4_ = uVar144;
      local_2e0._28_4_ = uVar144;
      auVar149._8_4_ = 1;
      auVar149._0_8_ = 0x100000001;
      auVar149._12_4_ = 1;
      auVar149._16_4_ = 1;
      auVar149._20_4_ = 1;
      auVar149._24_4_ = 1;
      auVar149._28_4_ = 1;
      local_300 = vpermps_avx2(auVar149,ZEXT1632(auVar6));
      auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x484);
      local_320 = vbroadcastss_avx512vl(auVar7);
      local_340 = vpermps_avx512vl(auVar149,ZEXT1632(auVar7));
      auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar87);
      local_380 = vpermps_avx512vl(auVar149,ZEXT1632(auVar87));
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0xd8c);
      fVar163 = auVar88._0_4_;
      local_3a0._4_4_ = fVar163;
      local_3a0._0_4_ = fVar163;
      fStack_398 = fVar163;
      fStack_394 = fVar163;
      fStack_390 = fVar163;
      fStack_38c = fVar163;
      fStack_388 = fVar163;
      register0x0000139c = fVar163;
      _local_3c0 = vpermps_avx512vl(auVar149,ZEXT1632(auVar88));
      auVar99 = vmulps_avx512vl(_local_3a0,auVar107);
      auVar97 = vmulps_avx512vl(_local_3c0,auVar107);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_360);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar108,local_380);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_320);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,local_340);
      auVar100 = vfmadd231ps_avx512vl(auVar99,auVar98,local_2e0);
      auVar192 = ZEXT3264(auVar100);
      auVar101 = vfmadd231ps_avx512vl(auVar97,auVar98,local_300);
      auVar191 = ZEXT3264(auVar101);
      auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar23);
      auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x484);
      auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x908);
      auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0xd8c);
      auVar95 = vmulps_avx512vl(_local_3a0,auVar105);
      auVar102 = vmulps_avx512vl(_local_3c0,auVar105);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar106,local_360);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_380);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar97,local_320);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_340);
      auVar8 = vfmadd231ps_fma(auVar95,auVar99,local_2e0);
      auVar196 = ZEXT1664(auVar8);
      auVar9 = vfmadd231ps_fma(auVar102,auVar99,local_300);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar8),auVar100);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar9),auVar101);
      auVar103 = vmulps_avx512vl(auVar101,auVar95);
      auVar93 = vmulps_avx512vl(auVar100,auVar102);
      auVar103 = vsubps_avx512vl(auVar103,auVar93);
      auVar86 = vshufps_avx(local_5a0,local_5a0,0xff);
      uVar160 = auVar89._0_8_;
      local_a0._8_8_ = uVar160;
      local_a0._0_8_ = uVar160;
      local_a0._16_8_ = uVar160;
      local_a0._24_8_ = uVar160;
      local_c0 = vbroadcastsd_avx512vl(auVar86);
      auVar86 = vshufps_avx512vl(local_5b0,local_5b0,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar86);
      auVar86 = vshufps_avx512vl(_local_5c0,_local_5c0,0xff);
      uVar160 = auVar86._0_8_;
      local_100._8_8_ = uVar160;
      local_100._0_8_ = uVar160;
      local_100._16_8_ = uVar160;
      local_100._24_8_ = uVar160;
      auVar93 = vmulps_avx512vl(local_100,auVar107);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_e0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_a0);
      auVar94 = vmulps_avx512vl(local_100,auVar105);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar106,local_e0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,local_c0);
      auVar10 = vfmadd231ps_fma(auVar94,auVar99,local_a0);
      auVar94 = vmulps_avx512vl(auVar102,auVar102);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar95,auVar95);
      auVar104 = vmaxps_avx512vl(auVar93,ZEXT1632(auVar10));
      auVar104 = vmulps_avx512vl(auVar104,auVar104);
      auVar94 = vmulps_avx512vl(auVar104,auVar94);
      auVar103 = vmulps_avx512vl(auVar103,auVar103);
      uVar160 = vcmpps_avx512vl(auVar103,auVar94,2);
      auVar86 = vblendps_avx(auVar6,local_5d0,8);
      auVar164 = auVar215._0_16_;
      auVar89 = vandps_avx512vl(auVar86,auVar164);
      auVar86 = vblendps_avx(auVar7,local_5a0,8);
      auVar86 = vandps_avx512vl(auVar86,auVar164);
      auVar89 = vmaxps_avx(auVar89,auVar86);
      auVar86 = vblendps_avx(auVar87,local_5b0,8);
      auVar90 = vandps_avx512vl(auVar86,auVar164);
      auVar86 = vblendps_avx(auVar88,_local_5c0,8);
      auVar86 = vandps_avx512vl(auVar86,auVar164);
      auVar86 = vmaxps_avx(auVar90,auVar86);
      auVar86 = vmaxps_avx(auVar89,auVar86);
      auVar89 = vmovshdup_avx(auVar86);
      auVar89 = vmaxss_avx(auVar89,auVar86);
      auVar86 = vshufpd_avx(auVar86,auVar86,1);
      auVar86 = vmaxss_avx(auVar86,auVar89);
      local_560 = vcvtsi2ss_avx512f(_local_5c0,iVar77);
      auVar204._0_4_ = local_560._0_4_;
      auVar204._4_4_ = auVar204._0_4_;
      auVar204._8_4_ = auVar204._0_4_;
      auVar204._12_4_ = auVar204._0_4_;
      auVar204._16_4_ = auVar204._0_4_;
      auVar204._20_4_ = auVar204._0_4_;
      auVar204._24_4_ = auVar204._0_4_;
      auVar204._28_4_ = auVar204._0_4_;
      uVar22 = vcmpps_avx512vl(auVar204,_DAT_01faff40,0xe);
      bVar82 = (byte)uVar160 & (byte)uVar22;
      local_5e0 = vmulss_avx512f(auVar86,auVar216._0_16_);
      auVar94 = auVar214._0_32_;
      auVar103 = vpermps_avx512vl(auVar94,ZEXT1632(auVar6));
      local_160 = vpermps_avx512vl(auVar94,ZEXT1632(auVar7));
      local_180 = vpermps_avx512vl(auVar94,ZEXT1632(auVar87));
      local_1a0 = vpermps_avx512vl(auVar94,ZEXT1632(auVar88));
      uVar74 = *(uint *)(ray + sVar81 * 4 + 0x30);
      local_4c0._0_16_ = ZEXT416(uVar74);
      if (bVar82 != 0) {
        auVar105 = vmulps_avx512vl(local_1a0,auVar105);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_180,auVar105);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_160,auVar106);
        auVar97 = vfmadd213ps_avx512vl(auVar99,auVar103,auVar97);
        auVar107 = vmulps_avx512vl(local_1a0,auVar107);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_180,auVar107);
        auVar106 = vfmadd213ps_avx512vl(auVar96,local_160,auVar108);
        auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1210);
        auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1694);
        auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1b18);
        auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1f9c);
        auVar106 = vfmadd213ps_avx512vl(auVar98,auVar103,auVar106);
        auVar199._0_4_ = fVar163 * auVar99._0_4_;
        auVar199._4_4_ = fVar163 * auVar99._4_4_;
        auVar199._8_4_ = fVar163 * auVar99._8_4_;
        auVar199._12_4_ = fVar163 * auVar99._12_4_;
        auVar199._16_4_ = fVar163 * auVar99._16_4_;
        auVar199._20_4_ = fVar163 * auVar99._20_4_;
        auVar199._24_4_ = fVar163 * auVar99._24_4_;
        auVar199._28_4_ = 0;
        auVar98 = vmulps_avx512vl(_local_3c0,auVar99);
        auVar99 = vmulps_avx512vl(local_1a0,auVar99);
        auVar105 = vfmadd231ps_avx512vl(auVar199,auVar107,local_360);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_380);
        auVar107 = vfmadd231ps_avx512vl(auVar99,local_180,auVar107);
        auVar99 = vfmadd231ps_avx512vl(auVar105,auVar108,local_320);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar108,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar107,local_160,auVar108);
        auVar86 = vfmadd231ps_fma(auVar99,auVar96,local_2e0);
        auVar99 = vfmadd231ps_avx512vl(auVar98,auVar96,local_300);
        auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1210);
        auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1b18);
        auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1f9c);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar96);
        auVar35._4_4_ = fVar163 * auVar107._4_4_;
        auVar35._0_4_ = fVar163 * auVar107._0_4_;
        auVar35._8_4_ = fVar163 * auVar107._8_4_;
        auVar35._12_4_ = fVar163 * auVar107._12_4_;
        auVar35._16_4_ = fVar163 * auVar107._16_4_;
        auVar35._20_4_ = fVar163 * auVar107._20_4_;
        auVar35._24_4_ = fVar163 * auVar107._24_4_;
        auVar35._28_4_ = auVar96._28_4_;
        auVar96 = vmulps_avx512vl(_local_3c0,auVar107);
        auVar107 = vmulps_avx512vl(local_1a0,auVar107);
        auVar104 = vfmadd231ps_avx512vl(auVar35,auVar108,local_360);
        auVar109 = vfmadd231ps_avx512vl(auVar96,auVar108,local_380);
        auVar213 = ZEXT3264(auVar103);
        auVar108 = vfmadd231ps_avx512vl(auVar107,local_180,auVar108);
        auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1694);
        auVar107 = vfmadd231ps_avx512vl(auVar104,auVar96,local_320);
        auVar104 = vfmadd231ps_avx512vl(auVar109,auVar96,local_340);
        auVar96 = vfmadd231ps_avx512vl(auVar108,local_160,auVar96);
        auVar216 = ZEXT1664(auVar216._0_16_);
        auVar214 = ZEXT3264(auVar94);
        auVar215 = ZEXT1664(auVar164);
        auVar89 = vfmadd231ps_fma(auVar107,auVar98,local_2e0);
        auVar108 = vfmadd231ps_avx512vl(auVar104,auVar98,local_300);
        auVar107 = vfmadd231ps_avx512vl(auVar96,auVar103,auVar98);
        auVar208._8_4_ = 0x7fffffff;
        auVar208._0_8_ = 0x7fffffff7fffffff;
        auVar208._12_4_ = 0x7fffffff;
        auVar208._16_4_ = 0x7fffffff;
        auVar208._20_4_ = 0x7fffffff;
        auVar208._24_4_ = 0x7fffffff;
        auVar208._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(ZEXT1632(auVar86),auVar208);
        auVar96 = vandps_avx(auVar99,auVar208);
        auVar96 = vmaxps_avx(auVar98,auVar96);
        auVar98 = vandps_avx(auVar105,auVar208);
        auVar98 = vmaxps_avx(auVar96,auVar98);
        auVar203._4_4_ = local_5e0._0_4_;
        auVar203._0_4_ = local_5e0._0_4_;
        auVar203._8_4_ = local_5e0._0_4_;
        auVar203._12_4_ = local_5e0._0_4_;
        auVar203._16_4_ = local_5e0._0_4_;
        auVar203._20_4_ = local_5e0._0_4_;
        auVar203._24_4_ = local_5e0._0_4_;
        auVar203._28_4_ = local_5e0._0_4_;
        uVar73 = vcmpps_avx512vl(auVar98,auVar203,1);
        bVar16 = (bool)((byte)uVar73 & 1);
        auVar110._0_4_ = (float)((uint)bVar16 * auVar95._0_4_ | (uint)!bVar16 * auVar86._0_4_);
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar86._4_4_);
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar86._8_4_);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar86._12_4_);
        fVar158 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar95._16_4_);
        auVar110._16_4_ = fVar158;
        fVar143 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar95._20_4_);
        auVar110._20_4_ = fVar143;
        fVar163 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar95._24_4_);
        auVar110._24_4_ = fVar163;
        uVar75 = (uint)(byte)(uVar73 >> 7) * auVar95._28_4_;
        auVar110._28_4_ = uVar75;
        bVar16 = (bool)((byte)uVar73 & 1);
        auVar111._0_4_ = (float)((uint)bVar16 * auVar102._0_4_ | (uint)!bVar16 * auVar99._0_4_);
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar99._4_4_);
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar99._8_4_);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar99._12_4_);
        bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar16 * auVar102._16_4_ | (uint)!bVar16 * auVar99._16_4_);
        bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar16 * auVar102._20_4_ | (uint)!bVar16 * auVar99._20_4_);
        bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar16 * auVar102._24_4_ | (uint)!bVar16 * auVar99._24_4_);
        bVar16 = SUB81(uVar73 >> 7,0);
        auVar111._28_4_ = (uint)bVar16 * auVar102._28_4_ | (uint)!bVar16 * auVar99._28_4_;
        auVar98 = vandps_avx(auVar208,ZEXT1632(auVar89));
        auVar96 = vandps_avx(auVar108,auVar208);
        auVar96 = vmaxps_avx(auVar98,auVar96);
        auVar98 = vandps_avx(auVar107,auVar208);
        auVar98 = vmaxps_avx(auVar96,auVar98);
        uVar73 = vcmpps_avx512vl(auVar98,auVar203,1);
        bVar16 = (bool)((byte)uVar73 & 1);
        auVar112._0_4_ = (float)((uint)bVar16 * auVar95._0_4_ | (uint)!bVar16 * auVar89._0_4_);
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar89._4_4_);
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar89._8_4_);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar89._12_4_);
        fVar178 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar95._16_4_);
        auVar112._16_4_ = fVar178;
        fVar173 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar95._20_4_);
        auVar112._20_4_ = fVar173;
        fVar159 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar95._24_4_);
        auVar112._24_4_ = fVar159;
        auVar112._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar95._28_4_;
        bVar16 = (bool)((byte)uVar73 & 1);
        auVar113._0_4_ = (float)((uint)bVar16 * auVar102._0_4_ | (uint)!bVar16 * auVar108._0_4_);
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar108._4_4_);
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar108._8_4_);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar108._12_4_);
        bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar16 * auVar102._16_4_ | (uint)!bVar16 * auVar108._16_4_);
        bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar16 * auVar102._20_4_ | (uint)!bVar16 * auVar108._20_4_);
        bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar16 * auVar102._24_4_ | (uint)!bVar16 * auVar108._24_4_);
        bVar16 = SUB81(uVar73 >> 7,0);
        auVar113._28_4_ = (uint)bVar16 * auVar102._28_4_ | (uint)!bVar16 * auVar108._28_4_;
        auVar91 = vxorps_avx512vl(local_320._0_16_,local_320._0_16_);
        auVar98 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar91));
        auVar86 = vfmadd231ps_fma(auVar98,auVar111,auVar111);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar84 = auVar98._0_4_;
        fVar85 = auVar98._4_4_;
        fVar172 = auVar98._8_4_;
        fVar135 = auVar98._12_4_;
        fVar136 = auVar98._16_4_;
        fVar137 = auVar98._20_4_;
        fVar139 = auVar98._24_4_;
        auVar36._4_4_ = fVar85 * fVar85 * fVar85 * auVar86._4_4_ * -0.5;
        auVar36._0_4_ = fVar84 * fVar84 * fVar84 * auVar86._0_4_ * -0.5;
        auVar36._8_4_ = fVar172 * fVar172 * fVar172 * auVar86._8_4_ * -0.5;
        auVar36._12_4_ = fVar135 * fVar135 * fVar135 * auVar86._12_4_ * -0.5;
        auVar36._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
        auVar36._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar36._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar36._28_4_ = 0;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar108 = vfmadd231ps_avx512vl(auVar36,auVar96,auVar98);
        auVar37._4_4_ = auVar111._4_4_ * auVar108._4_4_;
        auVar37._0_4_ = auVar111._0_4_ * auVar108._0_4_;
        auVar37._8_4_ = auVar111._8_4_ * auVar108._8_4_;
        auVar37._12_4_ = auVar111._12_4_ * auVar108._12_4_;
        auVar37._16_4_ = auVar111._16_4_ * auVar108._16_4_;
        auVar37._20_4_ = auVar111._20_4_ * auVar108._20_4_;
        auVar37._24_4_ = auVar111._24_4_ * auVar108._24_4_;
        auVar37._28_4_ = auVar98._28_4_;
        auVar38._4_4_ = auVar108._4_4_ * -auVar110._4_4_;
        auVar38._0_4_ = auVar108._0_4_ * -auVar110._0_4_;
        auVar38._8_4_ = auVar108._8_4_ * -auVar110._8_4_;
        auVar38._12_4_ = auVar108._12_4_ * -auVar110._12_4_;
        auVar38._16_4_ = auVar108._16_4_ * -fVar158;
        auVar38._20_4_ = auVar108._20_4_ * -fVar143;
        auVar38._24_4_ = auVar108._24_4_ * -fVar163;
        auVar38._28_4_ = uVar75 ^ 0x80000000;
        auVar98 = vmulps_avx512vl(auVar108,ZEXT1632(auVar91));
        auVar95 = ZEXT1632(auVar91);
        auVar107 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar95);
        auVar86 = vfmadd231ps_fma(auVar107,auVar113,auVar113);
        auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar163 = auVar107._0_4_;
        fVar143 = auVar107._4_4_;
        fVar158 = auVar107._8_4_;
        fVar84 = auVar107._12_4_;
        fVar85 = auVar107._16_4_;
        fVar172 = auVar107._20_4_;
        fVar135 = auVar107._24_4_;
        auVar39._4_4_ = fVar143 * fVar143 * fVar143 * auVar86._4_4_ * -0.5;
        auVar39._0_4_ = fVar163 * fVar163 * fVar163 * auVar86._0_4_ * -0.5;
        auVar39._8_4_ = fVar158 * fVar158 * fVar158 * auVar86._8_4_ * -0.5;
        auVar39._12_4_ = fVar84 * fVar84 * fVar84 * auVar86._12_4_ * -0.5;
        auVar39._16_4_ = fVar85 * fVar85 * fVar85 * -0.0;
        auVar39._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
        auVar39._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar39._28_4_ = 0;
        auVar96 = vfmadd231ps_avx512vl(auVar39,auVar96,auVar107);
        auVar40._4_4_ = auVar113._4_4_ * auVar96._4_4_;
        auVar40._0_4_ = auVar113._0_4_ * auVar96._0_4_;
        auVar40._8_4_ = auVar113._8_4_ * auVar96._8_4_;
        auVar40._12_4_ = auVar113._12_4_ * auVar96._12_4_;
        auVar40._16_4_ = auVar113._16_4_ * auVar96._16_4_;
        auVar40._20_4_ = auVar113._20_4_ * auVar96._20_4_;
        auVar40._24_4_ = auVar113._24_4_ * auVar96._24_4_;
        auVar40._28_4_ = auVar107._28_4_;
        auVar41._4_4_ = -auVar112._4_4_ * auVar96._4_4_;
        auVar41._0_4_ = -auVar112._0_4_ * auVar96._0_4_;
        auVar41._8_4_ = -auVar112._8_4_ * auVar96._8_4_;
        auVar41._12_4_ = -auVar112._12_4_ * auVar96._12_4_;
        auVar41._16_4_ = -fVar178 * auVar96._16_4_;
        auVar41._20_4_ = -fVar173 * auVar96._20_4_;
        auVar41._24_4_ = -fVar159 * auVar96._24_4_;
        auVar41._28_4_ = auVar108._28_4_;
        auVar96 = vmulps_avx512vl(auVar96,auVar95);
        auVar86 = vfmadd213ps_fma(auVar37,auVar93,auVar100);
        auVar89 = vfmadd213ps_fma(auVar38,auVar93,auVar101);
        auVar108 = vfmadd213ps_avx512vl(auVar98,auVar93,auVar106);
        auVar107 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar10),ZEXT1632(auVar8));
        auVar90 = vfnmadd213ps_fma(auVar37,auVar93,auVar100);
        auVar105 = ZEXT1632(auVar10);
        auVar88 = vfmadd213ps_fma(auVar41,auVar105,ZEXT1632(auVar9));
        auVar164 = vfnmadd213ps_fma(auVar38,auVar93,auVar101);
        auVar87 = vfmadd213ps_fma(auVar96,auVar105,auVar97);
        auVar99 = vfnmadd231ps_avx512vl(auVar106,auVar93,auVar98);
        auVar8 = vfnmadd213ps_fma(auVar40,auVar105,ZEXT1632(auVar8));
        auVar9 = vfnmadd213ps_fma(auVar41,auVar105,ZEXT1632(auVar9));
        auVar174 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar10),auVar96);
        auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar90));
        auVar98 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar164));
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar87),auVar99);
        auVar106 = vmulps_avx512vl(auVar98,auVar99);
        auVar6 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar164),auVar97);
        auVar42._4_4_ = auVar90._4_4_ * auVar97._4_4_;
        auVar42._0_4_ = auVar90._0_4_ * auVar97._0_4_;
        auVar42._8_4_ = auVar90._8_4_ * auVar97._8_4_;
        auVar42._12_4_ = auVar90._12_4_ * auVar97._12_4_;
        auVar42._16_4_ = auVar97._16_4_ * 0.0;
        auVar42._20_4_ = auVar97._20_4_ * 0.0;
        auVar42._24_4_ = auVar97._24_4_ * 0.0;
        auVar42._28_4_ = auVar97._28_4_;
        auVar97 = vfmsub231ps_avx512vl(auVar42,auVar99,auVar96);
        auVar43._4_4_ = auVar164._4_4_ * auVar96._4_4_;
        auVar43._0_4_ = auVar164._0_4_ * auVar96._0_4_;
        auVar43._8_4_ = auVar164._8_4_ * auVar96._8_4_;
        auVar43._12_4_ = auVar164._12_4_ * auVar96._12_4_;
        auVar43._16_4_ = auVar96._16_4_ * 0.0;
        auVar43._20_4_ = auVar96._20_4_ * 0.0;
        auVar43._24_4_ = auVar96._24_4_ * 0.0;
        auVar43._28_4_ = auVar96._28_4_;
        auVar7 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar90),auVar98);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar95,auVar97);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,ZEXT1632(auVar6));
        auVar102 = ZEXT1632(auVar91);
        uVar73 = vcmpps_avx512vl(auVar98,auVar102,2);
        bVar72 = (byte)uVar73;
        fVar84 = (float)((uint)(bVar72 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar8._0_4_);
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar172 = (float)((uint)bVar16 * auVar86._4_4_ | (uint)!bVar16 * auVar8._4_4_);
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar136 = (float)((uint)bVar16 * auVar86._8_4_ | (uint)!bVar16 * auVar8._8_4_);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar139 = (float)((uint)bVar16 * auVar86._12_4_ | (uint)!bVar16 * auVar8._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar172,fVar84))));
        fVar85 = (float)((uint)(bVar72 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar9._0_4_);
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar135 = (float)((uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar9._4_4_);
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar137 = (float)((uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar9._8_4_);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar140 = (float)((uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar9._12_4_);
        auVar105 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar137,CONCAT44(fVar135,fVar85))));
        auVar114._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar108._0_4_ |
                    (uint)!(bool)(bVar72 & 1) * auVar174._0_4_);
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar16 * auVar108._4_4_ | (uint)!bVar16 * auVar174._4_4_);
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar16 * auVar108._8_4_ | (uint)!bVar16 * auVar174._8_4_);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar16 * auVar108._12_4_ | (uint)!bVar16 * auVar174._12_4_);
        fVar163 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar108._16_4_);
        auVar114._16_4_ = fVar163;
        fVar158 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar108._20_4_);
        auVar114._20_4_ = fVar158;
        fVar143 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar108._24_4_);
        auVar114._24_4_ = fVar143;
        iVar1 = (uint)(byte)(uVar73 >> 7) * auVar108._28_4_;
        auVar114._28_4_ = iVar1;
        auVar96 = vblendmps_avx512vl(ZEXT1632(auVar90),auVar107);
        auVar115._0_4_ =
             (uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar6._0_4_;
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar6._4_4_;
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar6._8_4_;
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar6._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_;
        auVar115._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
        auVar96 = vblendmps_avx512vl(ZEXT1632(auVar164),ZEXT1632(auVar88));
        auVar116._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar89._0_4_)
        ;
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar89._4_4_);
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar89._8_4_);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar89._12_4_);
        fVar178 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_);
        auVar116._16_4_ = fVar178;
        fVar173 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_);
        auVar116._20_4_ = fVar173;
        fVar159 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_);
        auVar116._24_4_ = fVar159;
        auVar116._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
        auVar96 = vblendmps_avx512vl(auVar99,ZEXT1632(auVar87));
        auVar117._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar108._0_4_
                    );
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar108._4_4_);
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar108._8_4_);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar108._12_4_);
        bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar16 * auVar96._16_4_ | (uint)!bVar16 * auVar108._16_4_);
        bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar16 * auVar96._20_4_ | (uint)!bVar16 * auVar108._20_4_);
        bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar16 * auVar96._24_4_ | (uint)!bVar16 * auVar108._24_4_);
        bVar16 = SUB81(uVar73 >> 7,0);
        auVar117._28_4_ = (uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar108._28_4_;
        auVar118._0_4_ =
             (uint)(bVar72 & 1) * (int)auVar90._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar107._0_4_;
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar16 * (int)auVar90._4_4_ | (uint)!bVar16 * auVar107._4_4_;
        bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar16 * (int)auVar90._8_4_ | (uint)!bVar16 * auVar107._8_4_;
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar16 * (int)auVar90._12_4_ | (uint)!bVar16 * auVar107._12_4_;
        auVar118._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar107._16_4_;
        auVar118._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar107._20_4_;
        auVar118._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar107._24_4_;
        auVar118._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar107._28_4_;
        bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar119._0_4_ =
             (uint)(bVar72 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar87._0_4_;
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar87._4_4_;
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar87._8_4_;
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar87._12_4_;
        auVar119._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar99._16_4_;
        auVar119._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar99._20_4_;
        auVar119._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar99._24_4_;
        iVar2 = (uint)(byte)(uVar73 >> 7) * auVar99._28_4_;
        auVar119._28_4_ = iVar2;
        auVar100 = vsubps_avx512vl(auVar118,auVar106);
        auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar164._12_4_ |
                                                (uint)!bVar19 * auVar88._12_4_,
                                                CONCAT48((uint)bVar18 * (int)auVar164._8_4_ |
                                                         (uint)!bVar18 * auVar88._8_4_,
                                                         CONCAT44((uint)bVar16 * (int)auVar164._4_4_
                                                                  | (uint)!bVar16 * auVar88._4_4_,
                                                                  (uint)(bVar72 & 1) *
                                                                  (int)auVar164._0_4_ |
                                                                  (uint)!(bool)(bVar72 & 1) *
                                                                  auVar88._0_4_)))),auVar105);
        auVar192 = ZEXT3264(auVar96);
        auVar108 = vsubps_avx(auVar119,auVar114);
        auVar107 = vsubps_avx(auVar106,auVar115);
        auVar196 = ZEXT3264(auVar107);
        auVar99 = vsubps_avx(auVar105,auVar116);
        auVar97 = vsubps_avx(auVar114,auVar117);
        auVar44._4_4_ = auVar108._4_4_ * fVar172;
        auVar44._0_4_ = auVar108._0_4_ * fVar84;
        auVar44._8_4_ = auVar108._8_4_ * fVar136;
        auVar44._12_4_ = auVar108._12_4_ * fVar139;
        auVar44._16_4_ = auVar108._16_4_ * 0.0;
        auVar44._20_4_ = auVar108._20_4_ * 0.0;
        auVar44._24_4_ = auVar108._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar86 = vfmsub231ps_fma(auVar44,auVar114,auVar100);
        auVar45._4_4_ = fVar135 * auVar100._4_4_;
        auVar45._0_4_ = fVar85 * auVar100._0_4_;
        auVar45._8_4_ = fVar137 * auVar100._8_4_;
        auVar45._12_4_ = fVar140 * auVar100._12_4_;
        auVar45._16_4_ = auVar100._16_4_ * 0.0;
        auVar45._20_4_ = auVar100._20_4_ * 0.0;
        auVar45._24_4_ = auVar100._24_4_ * 0.0;
        auVar45._28_4_ = auVar98._28_4_;
        auVar89 = vfmsub231ps_fma(auVar45,auVar106,auVar96);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar102,ZEXT1632(auVar86));
        auVar187._0_4_ = auVar96._0_4_ * auVar114._0_4_;
        auVar187._4_4_ = auVar96._4_4_ * auVar114._4_4_;
        auVar187._8_4_ = auVar96._8_4_ * auVar114._8_4_;
        auVar187._12_4_ = auVar96._12_4_ * auVar114._12_4_;
        auVar187._16_4_ = auVar96._16_4_ * fVar163;
        auVar187._20_4_ = auVar96._20_4_ * fVar158;
        auVar187._24_4_ = auVar96._24_4_ * fVar143;
        auVar187._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar187,auVar105,auVar108);
        auVar101 = vfmadd231ps_avx512vl(auVar98,auVar102,ZEXT1632(auVar86));
        auVar98 = vmulps_avx512vl(auVar97,auVar115);
        auVar98 = vfmsub231ps_avx512vl(auVar98,auVar107,auVar117);
        auVar46._4_4_ = auVar99._4_4_ * auVar117._4_4_;
        auVar46._0_4_ = auVar99._0_4_ * auVar117._0_4_;
        auVar46._8_4_ = auVar99._8_4_ * auVar117._8_4_;
        auVar46._12_4_ = auVar99._12_4_ * auVar117._12_4_;
        auVar46._16_4_ = auVar99._16_4_ * auVar117._16_4_;
        auVar46._20_4_ = auVar99._20_4_ * auVar117._20_4_;
        auVar46._24_4_ = auVar99._24_4_ * auVar117._24_4_;
        auVar46._28_4_ = auVar117._28_4_;
        auVar86 = vfmsub231ps_fma(auVar46,auVar116,auVar97);
        auVar188._0_4_ = auVar116._0_4_ * auVar107._0_4_;
        auVar188._4_4_ = auVar116._4_4_ * auVar107._4_4_;
        auVar188._8_4_ = auVar116._8_4_ * auVar107._8_4_;
        auVar188._12_4_ = auVar116._12_4_ * auVar107._12_4_;
        auVar188._16_4_ = fVar178 * auVar107._16_4_;
        auVar188._20_4_ = fVar173 * auVar107._20_4_;
        auVar188._24_4_ = fVar159 * auVar107._24_4_;
        auVar188._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar188,auVar99,auVar115);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar102,auVar98);
        auVar95 = vfmadd231ps_avx512vl(auVar98,auVar102,ZEXT1632(auVar86));
        auVar191 = ZEXT3264(auVar95);
        auVar98 = vmaxps_avx(auVar101,auVar95);
        uVar160 = vcmpps_avx512vl(auVar98,auVar102,2);
        bVar82 = bVar82 & (byte)uVar160;
        if (bVar82 != 0) {
          uVar144 = *(undefined4 *)(ray + sVar81 * 4 + 0x80);
          auVar209._4_4_ = uVar144;
          auVar209._0_4_ = uVar144;
          auVar209._8_4_ = uVar144;
          auVar209._12_4_ = uVar144;
          auVar209._16_4_ = uVar144;
          auVar209._20_4_ = uVar144;
          auVar209._24_4_ = uVar144;
          auVar209._28_4_ = uVar144;
          auVar212 = ZEXT3264(auVar209);
          auVar47._4_4_ = auVar97._4_4_ * auVar96._4_4_;
          auVar47._0_4_ = auVar97._0_4_ * auVar96._0_4_;
          auVar47._8_4_ = auVar97._8_4_ * auVar96._8_4_;
          auVar47._12_4_ = auVar97._12_4_ * auVar96._12_4_;
          auVar47._16_4_ = auVar97._16_4_ * auVar96._16_4_;
          auVar47._20_4_ = auVar97._20_4_ * auVar96._20_4_;
          auVar47._24_4_ = auVar97._24_4_ * auVar96._24_4_;
          auVar47._28_4_ = auVar98._28_4_;
          auVar87 = vfmsub231ps_fma(auVar47,auVar99,auVar108);
          auVar48._4_4_ = auVar108._4_4_ * auVar107._4_4_;
          auVar48._0_4_ = auVar108._0_4_ * auVar107._0_4_;
          auVar48._8_4_ = auVar108._8_4_ * auVar107._8_4_;
          auVar48._12_4_ = auVar108._12_4_ * auVar107._12_4_;
          auVar48._16_4_ = auVar108._16_4_ * auVar107._16_4_;
          auVar48._20_4_ = auVar108._20_4_ * auVar107._20_4_;
          auVar48._24_4_ = auVar108._24_4_ * auVar107._24_4_;
          auVar48._28_4_ = auVar108._28_4_;
          auVar88 = vfmsub231ps_fma(auVar48,auVar100,auVar97);
          auVar49._4_4_ = auVar99._4_4_ * auVar100._4_4_;
          auVar49._0_4_ = auVar99._0_4_ * auVar100._0_4_;
          auVar49._8_4_ = auVar99._8_4_ * auVar100._8_4_;
          auVar49._12_4_ = auVar99._12_4_ * auVar100._12_4_;
          auVar49._16_4_ = auVar99._16_4_ * auVar100._16_4_;
          auVar49._20_4_ = auVar99._20_4_ * auVar100._20_4_;
          auVar49._24_4_ = auVar99._24_4_ * auVar100._24_4_;
          auVar49._28_4_ = auVar99._28_4_;
          auVar6 = vfmsub231ps_fma(auVar49,auVar107,auVar96);
          auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar6));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar98 = vrcp14ps_avx512vl(ZEXT1632(auVar89));
          auVar196 = ZEXT3264(auVar98);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = 0x3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar96 = vfnmadd213ps_avx512vl(auVar98,ZEXT1632(auVar89),auVar28);
          auVar86 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
          auVar192 = ZEXT1664(auVar86);
          auVar50._4_4_ = auVar6._4_4_ * auVar114._4_4_;
          auVar50._0_4_ = auVar6._0_4_ * auVar114._0_4_;
          auVar50._8_4_ = auVar6._8_4_ * auVar114._8_4_;
          auVar50._12_4_ = auVar6._12_4_ * auVar114._12_4_;
          auVar50._16_4_ = fVar163 * 0.0;
          auVar50._20_4_ = fVar158 * 0.0;
          auVar50._24_4_ = fVar143 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar88 = vfmadd231ps_fma(auVar50,auVar105,ZEXT1632(auVar88));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar106,ZEXT1632(auVar87));
          fVar163 = auVar86._0_4_;
          fVar143 = auVar86._4_4_;
          fVar158 = auVar86._8_4_;
          fVar159 = auVar86._12_4_;
          local_500 = ZEXT1632(CONCAT412(auVar88._12_4_ * fVar159,
                                         CONCAT48(auVar88._8_4_ * fVar158,
                                                  CONCAT44(auVar88._4_4_ * fVar143,
                                                           auVar88._0_4_ * fVar163))));
          auVar197 = ZEXT3264(local_500);
          auVar150._4_4_ = uVar74;
          auVar150._0_4_ = uVar74;
          auVar150._8_4_ = uVar74;
          auVar150._12_4_ = uVar74;
          auVar150._16_4_ = uVar74;
          auVar150._20_4_ = uVar74;
          auVar150._24_4_ = uVar74;
          auVar150._28_4_ = uVar74;
          uVar160 = vcmpps_avx512vl(local_500,auVar209,2);
          uVar22 = vcmpps_avx512vl(auVar150,local_500,2);
          bVar82 = (byte)uVar160 & (byte)uVar22 & bVar82;
          if (bVar82 != 0) {
            uVar83 = vcmpps_avx512vl(ZEXT1632(auVar89),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar83 = bVar82 & uVar83;
            if ((char)uVar83 != '\0') {
              fVar173 = auVar101._0_4_ * fVar163;
              fVar178 = auVar101._4_4_ * fVar143;
              auVar51._4_4_ = fVar178;
              auVar51._0_4_ = fVar173;
              fVar84 = auVar101._8_4_ * fVar158;
              auVar51._8_4_ = fVar84;
              fVar85 = auVar101._12_4_ * fVar159;
              auVar51._12_4_ = fVar85;
              fVar172 = auVar101._16_4_ * 0.0;
              auVar51._16_4_ = fVar172;
              fVar135 = auVar101._20_4_ * 0.0;
              auVar51._20_4_ = fVar135;
              fVar136 = auVar101._24_4_ * 0.0;
              auVar51._24_4_ = fVar136;
              auVar51._28_4_ = auVar101._28_4_;
              auVar151._8_4_ = 0x3f800000;
              auVar151._0_8_ = 0x3f8000003f800000;
              auVar151._12_4_ = 0x3f800000;
              auVar151._16_4_ = 0x3f800000;
              auVar151._20_4_ = 0x3f800000;
              auVar151._24_4_ = 0x3f800000;
              auVar151._28_4_ = 0x3f800000;
              auVar98 = vsubps_avx(auVar151,auVar51);
              local_2c0._0_4_ =
                   (float)((uint)(bVar72 & 1) * (int)fVar173 |
                          (uint)!(bool)(bVar72 & 1) * auVar98._0_4_);
              bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
              local_2c0._4_4_ = (float)((uint)bVar16 * (int)fVar178 | (uint)!bVar16 * auVar98._4_4_)
              ;
              bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar16 * (int)fVar84 | (uint)!bVar16 * auVar98._8_4_);
              bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar16 * (int)fVar85 | (uint)!bVar16 * auVar98._12_4_);
              bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar16 * (int)fVar172 | (uint)!bVar16 * auVar98._16_4_);
              bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar16 * (int)fVar135 | (uint)!bVar16 * auVar98._20_4_);
              bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar16 * (int)fVar136 | (uint)!bVar16 * auVar98._24_4_);
              bVar16 = SUB81(uVar73 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar98._28_4_);
              auVar98 = vsubps_avx(ZEXT1632(auVar10),auVar93);
              auVar86 = vfmadd213ps_fma(auVar98,local_2c0,auVar93);
              uVar144 = *(undefined4 *)((long)pre->ray_space + sVar81 * 4 + -0x10);
              auVar29._4_4_ = uVar144;
              auVar29._0_4_ = uVar144;
              auVar29._8_4_ = uVar144;
              auVar29._12_4_ = uVar144;
              auVar29._16_4_ = uVar144;
              auVar29._20_4_ = uVar144;
              auVar29._24_4_ = uVar144;
              auVar29._28_4_ = uVar144;
              auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                           CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                    CONCAT44(auVar86._4_4_ +
                                                                             auVar86._4_4_,
                                                                             auVar86._0_4_ +
                                                                             auVar86._0_4_)))),
                                        auVar29);
              uVar76 = vcmpps_avx512vl(local_500,auVar98,6);
              uVar83 = uVar83 & uVar76;
              bVar82 = (byte)uVar83;
              if (bVar82 != 0) {
                auVar170._0_4_ = auVar95._0_4_ * fVar163;
                auVar170._4_4_ = auVar95._4_4_ * fVar143;
                auVar170._8_4_ = auVar95._8_4_ * fVar158;
                auVar170._12_4_ = auVar95._12_4_ * fVar159;
                auVar170._16_4_ = auVar95._16_4_ * 0.0;
                auVar170._20_4_ = auVar95._20_4_ * 0.0;
                auVar170._24_4_ = auVar95._24_4_ * 0.0;
                auVar170._28_4_ = 0;
                auVar175._8_4_ = 0x3f800000;
                auVar175._0_8_ = 0x3f8000003f800000;
                auVar175._12_4_ = 0x3f800000;
                auVar175._16_4_ = 0x3f800000;
                auVar175._20_4_ = 0x3f800000;
                auVar175._24_4_ = 0x3f800000;
                auVar175._28_4_ = 0x3f800000;
                auVar98 = vsubps_avx(auVar175,auVar170);
                auVar120._0_4_ =
                     (uint)(bVar72 & 1) * (int)auVar170._0_4_ |
                     (uint)!(bool)(bVar72 & 1) * auVar98._0_4_;
                bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
                auVar120._4_4_ = (uint)bVar16 * (int)auVar170._4_4_ | (uint)!bVar16 * auVar98._4_4_;
                bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                auVar120._8_4_ = (uint)bVar16 * (int)auVar170._8_4_ | (uint)!bVar16 * auVar98._8_4_;
                bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
                auVar120._12_4_ =
                     (uint)bVar16 * (int)auVar170._12_4_ | (uint)!bVar16 * auVar98._12_4_;
                bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
                auVar120._16_4_ =
                     (uint)bVar16 * (int)auVar170._16_4_ | (uint)!bVar16 * auVar98._16_4_;
                bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                auVar120._20_4_ =
                     (uint)bVar16 * (int)auVar170._20_4_ | (uint)!bVar16 * auVar98._20_4_;
                bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                auVar120._24_4_ =
                     (uint)bVar16 * (int)auVar170._24_4_ | (uint)!bVar16 * auVar98._24_4_;
                auVar120._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar98._28_4_;
                auVar30._8_4_ = 0x40000000;
                auVar30._0_8_ = 0x4000000040000000;
                auVar30._12_4_ = 0x40000000;
                auVar30._16_4_ = 0x40000000;
                auVar30._20_4_ = 0x40000000;
                auVar30._24_4_ = 0x40000000;
                auVar30._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar120,auVar175,auVar30);
                local_280 = local_500;
                local_260 = 0;
                local_25c = iVar77;
                auVar196 = ZEXT1664(local_5d0);
                local_250 = local_5d0;
                local_240 = local_5a0._0_8_;
                uStack_238 = local_5a0._8_8_;
                local_230 = local_5b0._0_8_;
                uStack_228 = local_5b0._8_8_;
                local_220 = local_5c0;
                uStack_218 = uStack_5b8;
                if ((pGVar13->mask & *(uint *)(ray + sVar81 * 4 + 0x90)) != 0) {
                  local_4e0 = SUB84(pGVar13,0);
                  uStack_4dc = (undefined4)((ulong)pGVar13 >> 0x20);
                  fVar163 = 1.0 / auVar204._0_4_;
                  local_200[0] = fVar163 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar163 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar163 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar163 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar163 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar163 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar163 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_500;
                  auVar152._8_4_ = 0x7f800000;
                  auVar152._0_8_ = 0x7f8000007f800000;
                  auVar152._12_4_ = 0x7f800000;
                  auVar152._16_4_ = 0x7f800000;
                  auVar152._20_4_ = 0x7f800000;
                  auVar152._24_4_ = 0x7f800000;
                  auVar152._28_4_ = 0x7f800000;
                  auVar98 = vblendmps_avx512vl(auVar152,local_500);
                  auVar121._0_4_ =
                       (uint)(bVar82 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar121._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar121._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar121._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                  auVar121._16_4_ = (uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
                  auVar121._20_4_ = (uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                  auVar121._24_4_ = (uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = SUB81(uVar83 >> 7,0);
                  auVar121._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar98 = vshufps_avx(auVar121,auVar121,0xb1);
                  auVar98 = vminps_avx(auVar121,auVar98);
                  auVar96 = vshufpd_avx(auVar98,auVar98,5);
                  auVar98 = vminps_avx(auVar98,auVar96);
                  auVar96 = vpermpd_avx2(auVar98,0x4e);
                  auVar98 = vminps_avx(auVar98,auVar96);
                  uVar160 = vcmpps_avx512vl(auVar121,auVar98,0);
                  uVar74 = (uint)uVar83;
                  if (((byte)uVar160 & bVar82) != 0) {
                    uVar74 = (uint)((byte)uVar160 & bVar82);
                  }
                  uVar75 = 0;
                  for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                    uVar75 = uVar75 + 1;
                  }
                  uVar73 = (ulong)uVar75;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_530 = vpbroadcastd_avx512vl();
                    local_540 = vpbroadcastd_avx512vl();
                    local_520 = auVar103;
                    do {
                      fVar163 = local_200[uVar73];
                      local_420._4_4_ = fVar163;
                      local_420._0_4_ = fVar163;
                      local_420._8_4_ = fVar163;
                      local_420._12_4_ = fVar163;
                      local_410 = *(undefined4 *)(local_1e0 + uVar73 * 4);
                      *(undefined4 *)(ray + sVar81 * 4 + 0x80) =
                           *(undefined4 *)(local_1c0 + uVar73 * 4);
                      local_590.context = context->user;
                      fVar143 = 1.0 - fVar163;
                      auVar27._8_4_ = 0x80000000;
                      auVar27._0_8_ = 0x8000000080000000;
                      auVar27._12_4_ = 0x80000000;
                      auVar88 = vxorps_avx512vl(ZEXT416((uint)fVar143),auVar27);
                      auVar86 = ZEXT416((uint)(fVar163 * fVar143 * 4.0));
                      auVar89 = vfnmsub213ss_fma(local_420,local_420,auVar86);
                      auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),
                                                auVar86);
                      fVar143 = fVar143 * auVar88._0_4_ * 0.5;
                      fVar158 = auVar89._0_4_ * 0.5;
                      auVar192 = ZEXT464((uint)fVar158);
                      fVar159 = auVar86._0_4_ * 0.5;
                      fVar163 = fVar163 * fVar163 * 0.5;
                      auVar185._0_4_ = fVar163 * (float)local_5c0._0_4_;
                      auVar185._4_4_ = fVar163 * (float)local_5c0._4_4_;
                      auVar185._8_4_ = fVar163 * (float)uStack_5b8;
                      auVar185._12_4_ = fVar163 * uStack_5b8._4_4_;
                      auVar147._4_4_ = fVar159;
                      auVar147._0_4_ = fVar159;
                      auVar147._8_4_ = fVar159;
                      auVar147._12_4_ = fVar159;
                      auVar86 = vfmadd132ps_fma(auVar147,auVar185,local_5b0);
                      auVar186._4_4_ = fVar158;
                      auVar186._0_4_ = fVar158;
                      auVar186._8_4_ = fVar158;
                      auVar186._12_4_ = fVar158;
                      auVar86 = vfmadd132ps_fma(auVar186,auVar86,local_5a0);
                      auVar148._4_4_ = fVar143;
                      auVar148._0_4_ = fVar143;
                      auVar148._8_4_ = fVar143;
                      auVar148._12_4_ = fVar143;
                      auVar86 = vfmadd213ps_fma(auVar148,auVar196._0_16_,auVar86);
                      local_450 = auVar86._0_4_;
                      local_440 = vshufps_avx(auVar86,auVar86,0x55);
                      auVar191 = ZEXT1664(local_440);
                      local_430 = vshufps_avx(auVar86,auVar86,0xaa);
                      iStack_44c = local_450;
                      iStack_448 = local_450;
                      iStack_444 = local_450;
                      uStack_40c = local_410;
                      uStack_408 = local_410;
                      uStack_404 = local_410;
                      local_400 = local_540._0_8_;
                      uStack_3f8 = local_540._8_8_;
                      local_3f0 = local_530;
                      vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                      uStack_3dc = (local_590.context)->instID[0];
                      local_3e0 = uStack_3dc;
                      uStack_3d8 = uStack_3dc;
                      uStack_3d4 = uStack_3dc;
                      uStack_3d0 = (local_590.context)->instPrimID[0];
                      uStack_3cc = uStack_3d0;
                      uStack_3c8 = uStack_3d0;
                      uStack_3c4 = uStack_3d0;
                      local_600 = local_490;
                      local_590.valid = (int *)local_600;
                      local_590.geometryUserPtr = *(void **)(CONCAT44(uStack_4dc,local_4e0) + 0x18);
                      local_590.hit = (RTCHitN *)&local_450;
                      local_590.N = 4;
                      pcVar15 = *(code **)(CONCAT44(uStack_4dc,local_4e0) + 0x40);
                      local_480 = auVar212._0_32_;
                      local_590.ray = (RTCRayN *)ray;
                      if (pcVar15 != (code *)0x0) {
                        auVar191 = ZEXT1664(local_440);
                        auVar192 = ZEXT464((uint)fVar158);
                        (*pcVar15)(&local_590);
                        auVar197 = ZEXT3264(local_500);
                        auVar212 = ZEXT3264(local_480);
                        auVar213 = ZEXT3264(local_520);
                        auVar196 = ZEXT1664(local_5d0);
                        auVar216 = ZEXT464(0x35000000);
                        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar215 = ZEXT1664(auVar86);
                        auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar214 = ZEXT3264(auVar98);
                        sVar81 = local_548;
                      }
                      uVar76 = vptestmd_avx512vl(local_600,local_600);
                      if ((uVar76 & 0xf) == 0) {
LAB_01cba721:
                        *(int *)(ray + sVar81 * 4 + 0x80) = auVar212._0_4_;
                      }
                      else {
                        p_Var14 = context->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(CONCAT44(uStack_4dc,local_4e0) + 0x3e) & 0x40) != 0)))) {
                          auVar191 = ZEXT1664(auVar191._0_16_);
                          auVar192 = ZEXT1664(auVar192._0_16_);
                          (*p_Var14)(&local_590);
                          auVar197 = ZEXT3264(local_500);
                          auVar212 = ZEXT3264(local_480);
                          auVar213 = ZEXT3264(local_520);
                          auVar196 = ZEXT1664(local_5d0);
                          auVar216 = ZEXT464(0x35000000);
                          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar215 = ZEXT1664(auVar86);
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar214 = ZEXT3264(auVar98);
                          sVar81 = local_548;
                        }
                        uVar76 = vptestmd_avx512vl(local_600,local_600);
                        uVar76 = uVar76 & 0xf;
                        bVar82 = (byte)uVar76;
                        if (bVar82 == 0) goto LAB_01cba721;
                        iVar1 = *(int *)(local_590.hit + 4);
                        iVar2 = *(int *)(local_590.hit + 8);
                        iVar70 = *(int *)(local_590.hit + 0xc);
                        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar18 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_590.ray + 0xc0) =
                             (uint)(bVar82 & 1) * *(int *)local_590.hit |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_590.ray + 0xc0);
                        *(uint *)(local_590.ray + 0xc4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0xc4);
                        *(uint *)(local_590.ray + 200) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 200);
                        *(uint *)(local_590.ray + 0xcc) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_590.ray + 0xcc);
                        iVar1 = *(int *)(local_590.hit + 0x14);
                        iVar2 = *(int *)(local_590.hit + 0x18);
                        iVar70 = *(int *)(local_590.hit + 0x1c);
                        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar18 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_590.ray + 0xd0) =
                             (uint)(bVar82 & 1) * *(int *)(local_590.hit + 0x10) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_590.ray + 0xd0);
                        *(uint *)(local_590.ray + 0xd4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0xd4);
                        *(uint *)(local_590.ray + 0xd8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd8);
                        *(uint *)(local_590.ray + 0xdc) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_590.ray + 0xdc);
                        iVar1 = *(int *)(local_590.hit + 0x24);
                        iVar2 = *(int *)(local_590.hit + 0x28);
                        iVar70 = *(int *)(local_590.hit + 0x2c);
                        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar18 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_590.ray + 0xe0) =
                             (uint)(bVar82 & 1) * *(int *)(local_590.hit + 0x20) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_590.ray + 0xe0);
                        *(uint *)(local_590.ray + 0xe4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0xe4);
                        *(uint *)(local_590.ray + 0xe8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe8);
                        *(uint *)(local_590.ray + 0xec) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_590.ray + 0xec);
                        iVar1 = *(int *)(local_590.hit + 0x34);
                        iVar2 = *(int *)(local_590.hit + 0x38);
                        iVar70 = *(int *)(local_590.hit + 0x3c);
                        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar18 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_590.ray + 0xf0) =
                             (uint)(bVar82 & 1) * *(int *)(local_590.hit + 0x30) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_590.ray + 0xf0);
                        *(uint *)(local_590.ray + 0xf4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0xf4);
                        *(uint *)(local_590.ray + 0xf8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf8);
                        *(uint *)(local_590.ray + 0xfc) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_590.ray + 0xfc);
                        iVar1 = *(int *)(local_590.hit + 0x44);
                        iVar2 = *(int *)(local_590.hit + 0x48);
                        iVar70 = *(int *)(local_590.hit + 0x4c);
                        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar18 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_590.ray + 0x100) =
                             (uint)(bVar82 & 1) * *(int *)(local_590.hit + 0x40) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_590.ray + 0x100);
                        *(uint *)(local_590.ray + 0x104) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_590.ray + 0x104);
                        *(uint *)(local_590.ray + 0x108) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_590.ray + 0x108);
                        *(uint *)(local_590.ray + 0x10c) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_590.ray + 0x10c)
                        ;
                        auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                        *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar86;
                        auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                        *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar86;
                        auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                        *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar86;
                        auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                        *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar86;
                        auVar212 = ZEXT464(*(uint *)(ray + sVar81 * 4 + 0x80));
                      }
                      auVar103 = auVar213._0_32_;
                      bVar82 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & (byte)uVar83;
                      uVar144 = auVar212._0_4_;
                      auVar156._4_4_ = uVar144;
                      auVar156._0_4_ = uVar144;
                      auVar156._8_4_ = uVar144;
                      auVar156._12_4_ = uVar144;
                      auVar156._16_4_ = uVar144;
                      auVar156._20_4_ = uVar144;
                      auVar156._24_4_ = uVar144;
                      auVar156._28_4_ = uVar144;
                      uVar160 = vcmpps_avx512vl(auVar197._0_32_,auVar156,2);
                      if ((bVar82 & (byte)uVar160) == 0) goto LAB_01cb9618;
                      bVar82 = bVar82 & (byte)uVar160;
                      uVar83 = (ulong)bVar82;
                      auVar157._8_4_ = 0x7f800000;
                      auVar157._0_8_ = 0x7f8000007f800000;
                      auVar157._12_4_ = 0x7f800000;
                      auVar157._16_4_ = 0x7f800000;
                      auVar157._20_4_ = 0x7f800000;
                      auVar157._24_4_ = 0x7f800000;
                      auVar157._28_4_ = 0x7f800000;
                      auVar98 = vblendmps_avx512vl(auVar157,auVar197._0_32_);
                      auVar134._0_4_ =
                           (uint)(bVar82 & 1) * auVar98._0_4_ |
                           (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                      bVar16 = (bool)(bVar82 >> 1 & 1);
                      auVar134._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar82 >> 2 & 1);
                      auVar134._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar82 >> 3 & 1);
                      auVar134._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar82 >> 4 & 1);
                      auVar134._16_4_ = (uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar82 >> 5 & 1);
                      auVar134._20_4_ = (uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar82 >> 6 & 1);
                      auVar134._24_4_ = (uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * 0x7f800000;
                      auVar134._28_4_ =
                           (uint)(bVar82 >> 7) * auVar98._28_4_ |
                           (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                      auVar98 = vshufps_avx(auVar134,auVar134,0xb1);
                      auVar98 = vminps_avx(auVar134,auVar98);
                      auVar96 = vshufpd_avx(auVar98,auVar98,5);
                      auVar98 = vminps_avx(auVar98,auVar96);
                      auVar96 = vpermpd_avx2(auVar98,0x4e);
                      auVar98 = vminps_avx(auVar98,auVar96);
                      uVar160 = vcmpps_avx512vl(auVar134,auVar98,0);
                      bVar72 = (byte)uVar160 & bVar82;
                      if (bVar72 != 0) {
                        bVar82 = bVar72;
                      }
                      uVar74 = 0;
                      for (uVar75 = (uint)bVar82; (uVar75 & 1) == 0;
                          uVar75 = uVar75 >> 1 | 0x80000000) {
                        uVar74 = uVar74 + 1;
                      }
                      uVar73 = (ulong)uVar74;
                    } while( true );
                  }
                  fVar163 = local_200[uVar73];
                  uVar144 = *(undefined4 *)(local_1e0 + uVar73 * 4);
                  fVar143 = 1.0 - fVar163;
                  auVar24._8_4_ = 0x80000000;
                  auVar24._0_8_ = 0x8000000080000000;
                  auVar24._12_4_ = 0x80000000;
                  auVar88 = vxorps_avx512vl(ZEXT416((uint)fVar143),auVar24);
                  auVar86 = ZEXT416((uint)(fVar163 * fVar143 * 4.0));
                  auVar89 = vfnmsub213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar86);
                  auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),auVar86);
                  fVar143 = fVar143 * auVar88._0_4_ * 0.5;
                  fVar158 = auVar89._0_4_ * 0.5;
                  auVar192 = ZEXT464((uint)fVar158);
                  fVar159 = auVar86._0_4_ * 0.5;
                  fVar173 = fVar163 * fVar163 * 0.5;
                  auVar179._0_4_ = fVar173 * (float)local_5c0._0_4_;
                  auVar179._4_4_ = fVar173 * (float)local_5c0._4_4_;
                  auVar179._8_4_ = fVar173 * (float)uStack_5b8;
                  auVar179._12_4_ = fVar173 * uStack_5b8._4_4_;
                  auVar165._4_4_ = fVar159;
                  auVar165._0_4_ = fVar159;
                  auVar165._8_4_ = fVar159;
                  auVar165._12_4_ = fVar159;
                  auVar86 = vfmadd132ps_fma(auVar165,auVar179,local_5b0);
                  auVar180._4_4_ = fVar158;
                  auVar180._0_4_ = fVar158;
                  auVar180._8_4_ = fVar158;
                  auVar180._12_4_ = fVar158;
                  auVar86 = vfmadd132ps_fma(auVar180,auVar86,local_5a0);
                  auVar191 = ZEXT1664(auVar86);
                  auVar166._4_4_ = fVar143;
                  auVar166._0_4_ = fVar143;
                  auVar166._8_4_ = fVar143;
                  auVar166._12_4_ = fVar143;
                  auVar86 = vfmadd213ps_fma(auVar166,local_5d0,auVar86);
                  *(undefined4 *)(ray + sVar81 * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar73 * 4)
                  ;
                  *(int *)(ray + sVar81 * 4 + 0xc0) = auVar86._0_4_;
                  uVar12 = vextractps_avx(auVar86,1);
                  *(undefined4 *)(ray + sVar81 * 4 + 0xd0) = uVar12;
                  uVar12 = vextractps_avx(auVar86,2);
                  *(undefined4 *)(ray + sVar81 * 4 + 0xe0) = uVar12;
                  *(float *)(ray + sVar81 * 4 + 0xf0) = fVar163;
                  *(undefined4 *)(ray + sVar81 * 4 + 0x100) = uVar144;
                  *(undefined4 *)(ray + sVar81 * 4 + 0x110) = uVar3;
                  *(uint *)(ray + sVar81 * 4 + 0x120) = uVar79;
                  *(uint *)(ray + sVar81 * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + sVar81 * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01cb9618:
      if (8 < iVar77) {
        auVar98 = vpbroadcastd_avx512vl();
        auVar213 = ZEXT3264(auVar98);
        local_4e0 = local_5e0._0_4_;
        uStack_4dc = local_5e0._0_4_;
        uStack_4d8 = local_5e0._0_4_;
        uStack_4d4 = local_5e0._0_4_;
        uStack_4d0 = local_5e0._0_4_;
        uStack_4cc = local_5e0._0_4_;
        uStack_4c8 = local_5e0._0_4_;
        uStack_4c4 = local_5e0._0_4_;
        local_480._4_4_ = local_4c0._0_4_;
        local_480._0_4_ = local_4c0._0_4_;
        local_480._8_4_ = local_4c0._0_4_;
        local_480._12_4_ = local_4c0._0_4_;
        local_480._16_4_ = local_4c0._0_4_;
        local_480._20_4_ = local_4c0._0_4_;
        local_480._24_4_ = local_4c0._0_4_;
        local_480._28_4_ = local_4c0._0_4_;
        local_120 = 1.0 / (float)local_560._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_530 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar78 = 8;
        local_520 = auVar103;
LAB_01cb96be:
        auVar98 = vpbroadcastd_avx512vl();
        auVar98 = vpor_avx2(auVar98,_DAT_01fe9900);
        uVar22 = vpcmpgtd_avx512vl(auVar213._0_32_,auVar98);
        auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar78 * 4 + lVar23);
        auVar96 = *(undefined1 (*) [32])(lVar23 + 0x21aefac + lVar78 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar23 + 0x21af430 + lVar78 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar23 + 0x21af8b4 + lVar78 * 4);
        auVar197._0_4_ = auVar107._0_4_ * (float)local_3a0._0_4_;
        auVar197._4_4_ = auVar107._4_4_ * (float)local_3a0._4_4_;
        auVar197._8_4_ = auVar107._8_4_ * fStack_398;
        auVar197._12_4_ = auVar107._12_4_ * fStack_394;
        auVar197._16_4_ = auVar107._16_4_ * fStack_390;
        auVar197._20_4_ = auVar107._20_4_ * fStack_38c;
        auVar197._28_36_ = auVar192._28_36_;
        auVar197._24_4_ = auVar107._24_4_ * fStack_388;
        auVar192._0_4_ = auVar107._0_4_ * (float)local_3c0._0_4_;
        auVar192._4_4_ = auVar107._4_4_ * (float)local_3c0._4_4_;
        auVar192._8_4_ = auVar107._8_4_ * fStack_3b8;
        auVar192._12_4_ = auVar107._12_4_ * fStack_3b4;
        auVar192._16_4_ = auVar107._16_4_ * fStack_3b0;
        auVar192._20_4_ = auVar107._20_4_ * fStack_3ac;
        auVar192._28_36_ = auVar191._28_36_;
        auVar192._24_4_ = auVar107._24_4_ * fStack_3a8;
        auVar99 = vmulps_avx512vl(local_100,auVar107);
        auVar97 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar108,local_360);
        auVar106 = vfmadd231ps_avx512vl(auVar192._0_32_,auVar108,local_380);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_e0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,local_320);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar96,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar99,auVar96,local_c0);
        auVar86 = vfmadd231ps_fma(auVar97,auVar98,local_2e0);
        auVar192 = ZEXT1664(auVar86);
        auVar89 = vfmadd231ps_fma(auVar106,auVar98,local_300);
        auVar191 = ZEXT1664(auVar89);
        auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar78 * 4 + lVar23);
        auVar97 = *(undefined1 (*) [32])(lVar23 + 0x21b13cc + lVar78 * 4);
        auVar95 = vfmadd231ps_avx512vl(auVar105,auVar98,local_a0);
        auVar106 = *(undefined1 (*) [32])(lVar23 + 0x21b1850 + lVar78 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar23 + 0x21b1cd4 + lVar78 * 4);
        auVar212._0_4_ = auVar105._0_4_ * (float)local_3a0._0_4_;
        auVar212._4_4_ = auVar105._4_4_ * (float)local_3a0._4_4_;
        auVar212._8_4_ = auVar105._8_4_ * fStack_398;
        auVar212._12_4_ = auVar105._12_4_ * fStack_394;
        auVar212._16_4_ = auVar105._16_4_ * fStack_390;
        auVar212._20_4_ = auVar105._20_4_ * fStack_38c;
        auVar212._28_36_ = auVar196._28_36_;
        auVar212._24_4_ = auVar105._24_4_ * fStack_388;
        auVar52._4_4_ = auVar105._4_4_ * (float)local_3c0._4_4_;
        auVar52._0_4_ = auVar105._0_4_ * (float)local_3c0._0_4_;
        auVar52._8_4_ = auVar105._8_4_ * fStack_3b8;
        auVar52._12_4_ = auVar105._12_4_ * fStack_3b4;
        auVar52._16_4_ = auVar105._16_4_ * fStack_3b0;
        auVar52._20_4_ = auVar105._20_4_ * fStack_3ac;
        auVar52._24_4_ = auVar105._24_4_ * fStack_3a8;
        auVar52._28_4_ = uStack_3a4;
        auVar100 = vmulps_avx512vl(local_100,auVar105);
        auVar101 = vfmadd231ps_avx512vl(auVar212._0_32_,auVar106,local_360);
        auVar102 = vfmadd231ps_avx512vl(auVar52,auVar106,local_380);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_e0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_320);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_340);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_c0);
        auVar88 = vfmadd231ps_fma(auVar101,auVar99,local_2e0);
        auVar196 = ZEXT1664(auVar88);
        auVar87 = vfmadd231ps_fma(auVar102,auVar99,local_300);
        auVar102 = vfmadd231ps_avx512vl(auVar100,auVar99,local_a0);
        auVar103 = vmaxps_avx512vl(auVar95,auVar102);
        auVar100 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar86));
        auVar101 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar89));
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar89),auVar100);
        auVar94 = vmulps_avx512vl(ZEXT1632(auVar86),auVar101);
        auVar93 = vsubps_avx512vl(auVar93,auVar94);
        auVar94 = vmulps_avx512vl(auVar101,auVar101);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar100);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar94);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        uVar160 = vcmpps_avx512vl(auVar93,auVar103,2);
        bVar82 = (byte)uVar22 & (byte)uVar160;
        if (bVar82 != 0) {
          auVar105 = vmulps_avx512vl(local_1a0,auVar105);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_180,auVar105);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_160,auVar106);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_520,auVar97);
          auVar107 = vmulps_avx512vl(local_1a0,auVar107);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_180,auVar107);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar108);
          auVar97 = vfmadd213ps_avx512vl(auVar98,local_520,auVar96);
          auVar98 = *(undefined1 (*) [32])(lVar23 + 0x21afd38 + lVar78 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar23 + 0x21b01bc + lVar78 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar23 + 0x21b0640 + lVar78 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar23 + 0x21b0ac4 + lVar78 * 4);
          auVar106 = vmulps_avx512vl(_local_3a0,auVar107);
          auVar105 = vmulps_avx512vl(_local_3c0,auVar107);
          auVar107 = vmulps_avx512vl(local_1a0,auVar107);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_360);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,local_380);
          auVar108 = vfmadd231ps_avx512vl(auVar107,local_180,auVar108);
          auVar107 = vfmadd231ps_avx512vl(auVar106,auVar96,local_320);
          auVar106 = vfmadd231ps_avx512vl(auVar105,auVar96,local_340);
          auVar96 = vfmadd231ps_avx512vl(auVar108,local_160,auVar96);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,local_2e0);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,local_300);
          auVar6 = vfmadd231ps_fma(auVar96,auVar98,local_520);
          auVar98 = *(undefined1 (*) [32])(lVar23 + 0x21b2158 + lVar78 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar23 + 0x21b2a60 + lVar78 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar23 + 0x21b2ee4 + lVar78 * 4);
          auVar105 = vmulps_avx512vl(_local_3a0,auVar108);
          auVar103 = vmulps_avx512vl(_local_3c0,auVar108);
          auVar108 = vmulps_avx512vl(local_1a0,auVar108);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,local_360);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,local_380);
          auVar108 = vfmadd231ps_avx512vl(auVar108,local_180,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar23 + 0x21b25dc + lVar78 * 4);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,local_320);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,local_340);
          auVar96 = vfmadd231ps_avx512vl(auVar108,local_160,auVar96);
          auVar108 = vfmadd231ps_avx512vl(auVar105,auVar98,local_2e0);
          auVar105 = vfmadd231ps_avx512vl(auVar103,auVar98,local_300);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_520,auVar98);
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar107,auVar103);
          vandps_avx512vl(auVar106,auVar103);
          auVar98 = vmaxps_avx(auVar103,auVar103);
          vandps_avx512vl(ZEXT1632(auVar6),auVar103);
          auVar98 = vmaxps_avx(auVar98,auVar103);
          auVar71._4_4_ = uStack_4dc;
          auVar71._0_4_ = local_4e0;
          auVar71._8_4_ = uStack_4d8;
          auVar71._12_4_ = uStack_4d4;
          auVar71._16_4_ = uStack_4d0;
          auVar71._20_4_ = uStack_4cc;
          auVar71._24_4_ = uStack_4c8;
          auVar71._28_4_ = uStack_4c4;
          uVar73 = vcmpps_avx512vl(auVar98,auVar71,1);
          bVar16 = (bool)((byte)uVar73 & 1);
          auVar122._0_4_ = (float)((uint)bVar16 * auVar100._0_4_ | (uint)!bVar16 * auVar107._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar107._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar107._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar122._12_4_ =
               (float)((uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar107._12_4_);
          bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar122._16_4_ =
               (float)((uint)bVar16 * auVar100._16_4_ | (uint)!bVar16 * auVar107._16_4_);
          bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar122._20_4_ =
               (float)((uint)bVar16 * auVar100._20_4_ | (uint)!bVar16 * auVar107._20_4_);
          bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar122._24_4_ =
               (float)((uint)bVar16 * auVar100._24_4_ | (uint)!bVar16 * auVar107._24_4_);
          bVar16 = SUB81(uVar73 >> 7,0);
          auVar122._28_4_ = (uint)bVar16 * auVar100._28_4_ | (uint)!bVar16 * auVar107._28_4_;
          bVar16 = (bool)((byte)uVar73 & 1);
          auVar123._0_4_ = (float)((uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar106._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar106._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar106._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar123._12_4_ =
               (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar106._12_4_);
          bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar123._16_4_ =
               (float)((uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar106._16_4_);
          bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar123._20_4_ =
               (float)((uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar106._20_4_);
          bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar123._24_4_ =
               (float)((uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar106._24_4_);
          bVar16 = SUB81(uVar73 >> 7,0);
          auVar123._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar106._28_4_;
          vandps_avx512vl(auVar108,auVar103);
          vandps_avx512vl(auVar105,auVar103);
          auVar98 = vmaxps_avx(auVar123,auVar123);
          vandps_avx512vl(auVar96,auVar103);
          auVar98 = vmaxps_avx(auVar98,auVar123);
          uVar73 = vcmpps_avx512vl(auVar98,auVar71,1);
          bVar16 = (bool)((byte)uVar73 & 1);
          auVar124._0_4_ = (uint)bVar16 * auVar100._0_4_ | (uint)!bVar16 * auVar108._0_4_;
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar108._4_4_;
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar108._8_4_;
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar108._12_4_;
          bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar16 * auVar100._16_4_ | (uint)!bVar16 * auVar108._16_4_;
          bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar16 * auVar100._20_4_ | (uint)!bVar16 * auVar108._20_4_;
          bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar16 * auVar100._24_4_ | (uint)!bVar16 * auVar108._24_4_;
          bVar16 = SUB81(uVar73 >> 7,0);
          auVar124._28_4_ = (uint)bVar16 * auVar100._28_4_ | (uint)!bVar16 * auVar108._28_4_;
          bVar16 = (bool)((byte)uVar73 & 1);
          auVar125._0_4_ = (float)((uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar105._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar105._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar105._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar105._12_4_);
          bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar105._16_4_);
          bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar105._20_4_);
          bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar105._24_4_);
          bVar16 = SUB81(uVar73 >> 7,0);
          auVar125._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar105._28_4_;
          auVar200._8_4_ = 0x80000000;
          auVar200._0_8_ = 0x8000000080000000;
          auVar200._12_4_ = 0x80000000;
          auVar200._16_4_ = 0x80000000;
          auVar200._20_4_ = 0x80000000;
          auVar200._24_4_ = 0x80000000;
          auVar200._28_4_ = 0x80000000;
          auVar98 = vxorps_avx512vl(auVar124,auVar200);
          auVar92 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
          auVar96 = vfmadd213ps_avx512vl(auVar122,auVar122,ZEXT1632(auVar92));
          auVar6 = vfmadd231ps_fma(auVar96,auVar123,auVar123);
          auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar6));
          auVar210._8_4_ = 0xbf000000;
          auVar210._0_8_ = 0xbf000000bf000000;
          auVar210._12_4_ = 0xbf000000;
          auVar210._16_4_ = 0xbf000000;
          auVar210._20_4_ = 0xbf000000;
          auVar210._24_4_ = 0xbf000000;
          auVar210._28_4_ = 0xbf000000;
          fVar163 = auVar96._0_4_;
          fVar143 = auVar96._4_4_;
          fVar158 = auVar96._8_4_;
          fVar159 = auVar96._12_4_;
          fVar173 = auVar96._16_4_;
          fVar178 = auVar96._20_4_;
          fVar84 = auVar96._24_4_;
          auVar53._4_4_ = fVar143 * fVar143 * fVar143 * auVar6._4_4_ * -0.5;
          auVar53._0_4_ = fVar163 * fVar163 * fVar163 * auVar6._0_4_ * -0.5;
          auVar53._8_4_ = fVar158 * fVar158 * fVar158 * auVar6._8_4_ * -0.5;
          auVar53._12_4_ = fVar159 * fVar159 * fVar159 * auVar6._12_4_ * -0.5;
          auVar53._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar53._20_4_ = fVar178 * fVar178 * fVar178 * -0.0;
          auVar53._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
          auVar53._28_4_ = auVar123._28_4_;
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar96 = vfmadd231ps_avx512vl(auVar53,auVar108,auVar96);
          auVar54._4_4_ = auVar123._4_4_ * auVar96._4_4_;
          auVar54._0_4_ = auVar123._0_4_ * auVar96._0_4_;
          auVar54._8_4_ = auVar123._8_4_ * auVar96._8_4_;
          auVar54._12_4_ = auVar123._12_4_ * auVar96._12_4_;
          auVar54._16_4_ = auVar123._16_4_ * auVar96._16_4_;
          auVar54._20_4_ = auVar123._20_4_ * auVar96._20_4_;
          auVar54._24_4_ = auVar123._24_4_ * auVar96._24_4_;
          auVar54._28_4_ = 0;
          auVar55._4_4_ = auVar96._4_4_ * -auVar122._4_4_;
          auVar55._0_4_ = auVar96._0_4_ * -auVar122._0_4_;
          auVar55._8_4_ = auVar96._8_4_ * -auVar122._8_4_;
          auVar55._12_4_ = auVar96._12_4_ * -auVar122._12_4_;
          auVar55._16_4_ = auVar96._16_4_ * -auVar122._16_4_;
          auVar55._20_4_ = auVar96._20_4_ * -auVar122._20_4_;
          auVar55._24_4_ = auVar96._24_4_ * -auVar122._24_4_;
          auVar55._28_4_ = auVar123._28_4_;
          auVar107 = vmulps_avx512vl(auVar96,ZEXT1632(auVar92));
          auVar105 = ZEXT1632(auVar92);
          auVar96 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar105);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar125,auVar125);
          auVar106 = vrsqrt14ps_avx512vl(auVar96);
          auVar96 = vmulps_avx512vl(auVar96,auVar210);
          fVar163 = auVar106._0_4_;
          fVar143 = auVar106._4_4_;
          fVar158 = auVar106._8_4_;
          fVar159 = auVar106._12_4_;
          fVar173 = auVar106._16_4_;
          fVar178 = auVar106._20_4_;
          fVar84 = auVar106._24_4_;
          auVar56._4_4_ = fVar143 * fVar143 * fVar143 * auVar96._4_4_;
          auVar56._0_4_ = fVar163 * fVar163 * fVar163 * auVar96._0_4_;
          auVar56._8_4_ = fVar158 * fVar158 * fVar158 * auVar96._8_4_;
          auVar56._12_4_ = fVar159 * fVar159 * fVar159 * auVar96._12_4_;
          auVar56._16_4_ = fVar173 * fVar173 * fVar173 * auVar96._16_4_;
          auVar56._20_4_ = fVar178 * fVar178 * fVar178 * auVar96._20_4_;
          auVar56._24_4_ = fVar84 * fVar84 * fVar84 * auVar96._24_4_;
          auVar56._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar56,auVar108,auVar106);
          auVar57._4_4_ = auVar125._4_4_ * auVar96._4_4_;
          auVar57._0_4_ = auVar125._0_4_ * auVar96._0_4_;
          auVar57._8_4_ = auVar125._8_4_ * auVar96._8_4_;
          auVar57._12_4_ = auVar125._12_4_ * auVar96._12_4_;
          auVar57._16_4_ = auVar125._16_4_ * auVar96._16_4_;
          auVar57._20_4_ = auVar125._20_4_ * auVar96._20_4_;
          auVar57._24_4_ = auVar125._24_4_ * auVar96._24_4_;
          auVar57._28_4_ = auVar106._28_4_;
          auVar58._4_4_ = auVar96._4_4_ * auVar98._4_4_;
          auVar58._0_4_ = auVar96._0_4_ * auVar98._0_4_;
          auVar58._8_4_ = auVar96._8_4_ * auVar98._8_4_;
          auVar58._12_4_ = auVar96._12_4_ * auVar98._12_4_;
          auVar58._16_4_ = auVar96._16_4_ * auVar98._16_4_;
          auVar58._20_4_ = auVar96._20_4_ * auVar98._20_4_;
          auVar58._24_4_ = auVar96._24_4_ * auVar98._24_4_;
          auVar58._28_4_ = auVar98._28_4_;
          auVar98 = vmulps_avx512vl(auVar96,auVar105);
          auVar6 = vfmadd213ps_fma(auVar54,auVar95,ZEXT1632(auVar86));
          auVar7 = vfmadd213ps_fma(auVar55,auVar95,ZEXT1632(auVar89));
          auVar108 = vfmadd213ps_avx512vl(auVar107,auVar95,auVar97);
          auVar106 = vfmadd213ps_avx512vl(auVar57,auVar102,ZEXT1632(auVar88));
          auVar9 = vfnmadd213ps_fma(auVar54,auVar95,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar58,auVar102,ZEXT1632(auVar87));
          auVar10 = vfnmadd213ps_fma(auVar55,auVar95,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar98,auVar102,auVar99);
          auVar174 = vfnmadd231ps_fma(auVar97,auVar95,auVar107);
          auVar90 = vfnmadd213ps_fma(auVar57,auVar102,ZEXT1632(auVar88));
          auVar164 = vfnmadd213ps_fma(auVar58,auVar102,ZEXT1632(auVar87));
          auVar91 = vfnmadd231ps_fma(auVar99,auVar102,auVar98);
          auVar99 = vsubps_avx512vl(auVar106,ZEXT1632(auVar9));
          auVar98 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar10));
          auVar96 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar174));
          auVar59._4_4_ = auVar98._4_4_ * auVar174._4_4_;
          auVar59._0_4_ = auVar98._0_4_ * auVar174._0_4_;
          auVar59._8_4_ = auVar98._8_4_ * auVar174._8_4_;
          auVar59._12_4_ = auVar98._12_4_ * auVar174._12_4_;
          auVar59._16_4_ = auVar98._16_4_ * 0.0;
          auVar59._20_4_ = auVar98._20_4_ * 0.0;
          auVar59._24_4_ = auVar98._24_4_ * 0.0;
          auVar59._28_4_ = auVar107._28_4_;
          auVar88 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar10),auVar96);
          auVar60._4_4_ = auVar96._4_4_ * auVar9._4_4_;
          auVar60._0_4_ = auVar96._0_4_ * auVar9._0_4_;
          auVar60._8_4_ = auVar96._8_4_ * auVar9._8_4_;
          auVar60._12_4_ = auVar96._12_4_ * auVar9._12_4_;
          auVar60._16_4_ = auVar96._16_4_ * 0.0;
          auVar60._20_4_ = auVar96._20_4_ * 0.0;
          auVar60._24_4_ = auVar96._24_4_ * 0.0;
          auVar60._28_4_ = auVar96._28_4_;
          auVar87 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar174),auVar99);
          auVar61._4_4_ = auVar10._4_4_ * auVar99._4_4_;
          auVar61._0_4_ = auVar10._0_4_ * auVar99._0_4_;
          auVar61._8_4_ = auVar10._8_4_ * auVar99._8_4_;
          auVar61._12_4_ = auVar10._12_4_ * auVar99._12_4_;
          auVar61._16_4_ = auVar99._16_4_ * 0.0;
          auVar61._20_4_ = auVar99._20_4_ * 0.0;
          auVar61._24_4_ = auVar99._24_4_ * 0.0;
          auVar61._28_4_ = auVar99._28_4_;
          auVar8 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar9),auVar98);
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar105,ZEXT1632(auVar87));
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,ZEXT1632(auVar88));
          auVar93 = ZEXT1632(auVar92);
          uVar73 = vcmpps_avx512vl(auVar98,auVar93,2);
          bVar72 = (byte)uVar73;
          fVar135 = (float)((uint)(bVar72 & 1) * auVar6._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar90._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar137 = (float)((uint)bVar16 * auVar6._4_4_ | (uint)!bVar16 * auVar90._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar140 = (float)((uint)bVar16 * auVar6._8_4_ | (uint)!bVar16 * auVar90._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar141 = (float)((uint)bVar16 * auVar6._12_4_ | (uint)!bVar16 * auVar90._12_4_);
          auVar105 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar140,CONCAT44(fVar137,fVar135))));
          fVar136 = (float)((uint)(bVar72 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar164._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar139 = (float)((uint)bVar16 * auVar7._4_4_ | (uint)!bVar16 * auVar164._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar138 = (float)((uint)bVar16 * auVar7._8_4_ | (uint)!bVar16 * auVar164._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar142 = (float)((uint)bVar16 * auVar7._12_4_ | (uint)!bVar16 * auVar164._12_4_);
          auVar100 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar138,CONCAT44(fVar139,fVar136))));
          auVar126._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar91._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar16 * auVar108._4_4_ | (uint)!bVar16 * auVar91._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar16 * auVar108._8_4_ | (uint)!bVar16 * auVar91._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar16 * auVar108._12_4_ | (uint)!bVar16 * auVar91._12_4_)
          ;
          fVar158 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar108._16_4_);
          auVar126._16_4_ = fVar158;
          fVar143 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar108._20_4_);
          auVar126._20_4_ = fVar143;
          fVar163 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar108._24_4_);
          auVar126._24_4_ = fVar163;
          iVar1 = (uint)(byte)(uVar73 >> 7) * auVar108._28_4_;
          auVar126._28_4_ = iVar1;
          auVar98 = vblendmps_avx512vl(ZEXT1632(auVar9),auVar106);
          auVar127._0_4_ =
               (uint)(bVar72 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar88._0_4_;
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar88._4_4_;
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar88._8_4_;
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar88._12_4_;
          auVar127._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar98._16_4_;
          auVar127._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar98._20_4_;
          auVar127._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar98._24_4_;
          auVar127._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar98._28_4_;
          auVar98 = vblendmps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar86));
          auVar128._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar6._0_4_
                      );
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar6._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar6._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar6._12_4_);
          fVar178 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar98._16_4_);
          auVar128._16_4_ = fVar178;
          fVar173 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar98._20_4_);
          auVar128._20_4_ = fVar173;
          fVar159 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar98._24_4_);
          auVar128._24_4_ = fVar159;
          auVar128._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar98._28_4_;
          auVar98 = vblendmps_avx512vl(ZEXT1632(auVar174),ZEXT1632(auVar89));
          auVar129._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar7._0_4_
                      );
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar7._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar7._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar7._12_4_);
          fVar172 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar98._16_4_);
          auVar129._16_4_ = fVar172;
          fVar84 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar98._20_4_);
          auVar129._20_4_ = fVar84;
          fVar85 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar98._24_4_);
          auVar129._24_4_ = fVar85;
          iVar2 = (uint)(byte)(uVar73 >> 7) * auVar98._28_4_;
          auVar129._28_4_ = iVar2;
          auVar130._0_4_ =
               (uint)(bVar72 & 1) * (int)auVar9._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar106._0_4_;
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar16 * (int)auVar9._4_4_ | (uint)!bVar16 * auVar106._4_4_;
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar16 * (int)auVar9._8_4_ | (uint)!bVar16 * auVar106._8_4_;
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar16 * (int)auVar9._12_4_ | (uint)!bVar16 * auVar106._12_4_;
          auVar130._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar106._16_4_;
          auVar130._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar106._20_4_;
          auVar130._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar106._24_4_;
          auVar130._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar106._28_4_;
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar73 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar106 = vsubps_avx512vl(auVar130,auVar105);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar10._12_4_ |
                                                  (uint)!bVar20 * auVar86._12_4_,
                                                  CONCAT48((uint)bVar18 * (int)auVar10._8_4_ |
                                                           (uint)!bVar18 * auVar86._8_4_,
                                                           CONCAT44((uint)bVar16 *
                                                                    (int)auVar10._4_4_ |
                                                                    (uint)!bVar16 * auVar86._4_4_,
                                                                    (uint)(bVar72 & 1) *
                                                                    (int)auVar10._0_4_ |
                                                                    (uint)!(bool)(bVar72 & 1) *
                                                                    auVar86._0_4_)))),auVar100);
          auVar192 = ZEXT3264(auVar96);
          auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar174._12_4_ |
                                                   (uint)!bVar21 * auVar89._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar174._8_4_ |
                                                            (uint)!bVar19 * auVar89._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar174._4_4_ |
                                                                     (uint)!bVar17 * auVar89._4_4_,
                                                                     (uint)(bVar72 & 1) *
                                                                     (int)auVar174._0_4_ |
                                                                     (uint)!(bool)(bVar72 & 1) *
                                                                     auVar89._0_4_)))),auVar126);
          auVar107 = vsubps_avx(auVar105,auVar127);
          auVar196 = ZEXT3264(auVar107);
          auVar99 = vsubps_avx(auVar100,auVar128);
          auVar97 = vsubps_avx(auVar126,auVar129);
          auVar62._4_4_ = auVar108._4_4_ * fVar137;
          auVar62._0_4_ = auVar108._0_4_ * fVar135;
          auVar62._8_4_ = auVar108._8_4_ * fVar140;
          auVar62._12_4_ = auVar108._12_4_ * fVar141;
          auVar62._16_4_ = auVar108._16_4_ * 0.0;
          auVar62._20_4_ = auVar108._20_4_ * 0.0;
          auVar62._24_4_ = auVar108._24_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar62,auVar126,auVar106);
          auVar176._0_4_ = fVar136 * auVar106._0_4_;
          auVar176._4_4_ = fVar139 * auVar106._4_4_;
          auVar176._8_4_ = fVar138 * auVar106._8_4_;
          auVar176._12_4_ = fVar142 * auVar106._12_4_;
          auVar176._16_4_ = auVar106._16_4_ * 0.0;
          auVar176._20_4_ = auVar106._20_4_ * 0.0;
          auVar176._24_4_ = auVar106._24_4_ * 0.0;
          auVar176._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar176,auVar105,auVar96);
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar93,ZEXT1632(auVar86));
          auVar189._0_4_ = auVar96._0_4_ * auVar126._0_4_;
          auVar189._4_4_ = auVar96._4_4_ * auVar126._4_4_;
          auVar189._8_4_ = auVar96._8_4_ * auVar126._8_4_;
          auVar189._12_4_ = auVar96._12_4_ * auVar126._12_4_;
          auVar189._16_4_ = auVar96._16_4_ * fVar158;
          auVar189._20_4_ = auVar96._20_4_ * fVar143;
          auVar189._24_4_ = auVar96._24_4_ * fVar163;
          auVar189._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar189,auVar100,auVar108);
          auVar101 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar86));
          auVar98 = vmulps_avx512vl(auVar97,auVar127);
          auVar98 = vfmsub231ps_avx512vl(auVar98,auVar107,auVar129);
          auVar63._4_4_ = auVar99._4_4_ * auVar129._4_4_;
          auVar63._0_4_ = auVar99._0_4_ * auVar129._0_4_;
          auVar63._8_4_ = auVar99._8_4_ * auVar129._8_4_;
          auVar63._12_4_ = auVar99._12_4_ * auVar129._12_4_;
          auVar63._16_4_ = auVar99._16_4_ * fVar172;
          auVar63._20_4_ = auVar99._20_4_ * fVar84;
          auVar63._24_4_ = auVar99._24_4_ * fVar85;
          auVar63._28_4_ = iVar2;
          auVar86 = vfmsub231ps_fma(auVar63,auVar128,auVar97);
          auVar190._0_4_ = auVar128._0_4_ * auVar107._0_4_;
          auVar190._4_4_ = auVar128._4_4_ * auVar107._4_4_;
          auVar190._8_4_ = auVar128._8_4_ * auVar107._8_4_;
          auVar190._12_4_ = auVar128._12_4_ * auVar107._12_4_;
          auVar190._16_4_ = fVar178 * auVar107._16_4_;
          auVar190._20_4_ = fVar173 * auVar107._20_4_;
          auVar190._24_4_ = fVar159 * auVar107._24_4_;
          auVar190._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar190,auVar99,auVar127);
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar93,auVar98);
          auVar103 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar86));
          auVar191 = ZEXT3264(auVar103);
          auVar98 = vmaxps_avx(auVar101,auVar103);
          uVar160 = vcmpps_avx512vl(auVar98,auVar93,2);
          bVar82 = bVar82 & (byte)uVar160;
          if (bVar82 != 0) {
            uVar144 = *(undefined4 *)(ray + sVar81 * 4 + 0x80);
            auVar211._4_4_ = uVar144;
            auVar211._0_4_ = uVar144;
            auVar211._8_4_ = uVar144;
            auVar211._12_4_ = uVar144;
            auVar211._16_4_ = uVar144;
            auVar211._20_4_ = uVar144;
            auVar211._24_4_ = uVar144;
            auVar211._28_4_ = uVar144;
            auVar212 = ZEXT3264(auVar211);
            auVar64._4_4_ = auVar97._4_4_ * auVar96._4_4_;
            auVar64._0_4_ = auVar97._0_4_ * auVar96._0_4_;
            auVar64._8_4_ = auVar97._8_4_ * auVar96._8_4_;
            auVar64._12_4_ = auVar97._12_4_ * auVar96._12_4_;
            auVar64._16_4_ = auVar97._16_4_ * auVar96._16_4_;
            auVar64._20_4_ = auVar97._20_4_ * auVar96._20_4_;
            auVar64._24_4_ = auVar97._24_4_ * auVar96._24_4_;
            auVar64._28_4_ = auVar98._28_4_;
            auVar87 = vfmsub231ps_fma(auVar64,auVar99,auVar108);
            auVar65._4_4_ = auVar108._4_4_ * auVar107._4_4_;
            auVar65._0_4_ = auVar108._0_4_ * auVar107._0_4_;
            auVar65._8_4_ = auVar108._8_4_ * auVar107._8_4_;
            auVar65._12_4_ = auVar108._12_4_ * auVar107._12_4_;
            auVar65._16_4_ = auVar108._16_4_ * auVar107._16_4_;
            auVar65._20_4_ = auVar108._20_4_ * auVar107._20_4_;
            auVar65._24_4_ = auVar108._24_4_ * auVar107._24_4_;
            auVar65._28_4_ = auVar108._28_4_;
            auVar88 = vfmsub231ps_fma(auVar65,auVar106,auVar97);
            auVar66._4_4_ = auVar99._4_4_ * auVar106._4_4_;
            auVar66._0_4_ = auVar99._0_4_ * auVar106._0_4_;
            auVar66._8_4_ = auVar99._8_4_ * auVar106._8_4_;
            auVar66._12_4_ = auVar99._12_4_ * auVar106._12_4_;
            auVar66._16_4_ = auVar99._16_4_ * auVar106._16_4_;
            auVar66._20_4_ = auVar99._20_4_ * auVar106._20_4_;
            auVar66._24_4_ = auVar99._24_4_ * auVar106._24_4_;
            auVar66._28_4_ = auVar99._28_4_;
            auVar6 = vfmsub231ps_fma(auVar66,auVar107,auVar96);
            auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar6));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar87),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar98 = vrcp14ps_avx512vl(ZEXT1632(auVar89));
            auVar196 = ZEXT3264(auVar98);
            auVar32._8_4_ = 0x3f800000;
            auVar32._0_8_ = 0x3f8000003f800000;
            auVar32._12_4_ = 0x3f800000;
            auVar32._16_4_ = 0x3f800000;
            auVar32._20_4_ = 0x3f800000;
            auVar32._24_4_ = 0x3f800000;
            auVar32._28_4_ = 0x3f800000;
            auVar96 = vfnmadd213ps_avx512vl(auVar98,ZEXT1632(auVar89),auVar32);
            auVar86 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
            auVar192 = ZEXT1664(auVar86);
            auVar67._4_4_ = auVar6._4_4_ * auVar126._4_4_;
            auVar67._0_4_ = auVar6._0_4_ * auVar126._0_4_;
            auVar67._8_4_ = auVar6._8_4_ * auVar126._8_4_;
            auVar67._12_4_ = auVar6._12_4_ * auVar126._12_4_;
            auVar67._16_4_ = fVar158 * 0.0;
            auVar67._20_4_ = fVar143 * 0.0;
            auVar67._24_4_ = fVar163 * 0.0;
            auVar67._28_4_ = iVar1;
            auVar88 = vfmadd231ps_fma(auVar67,auVar100,ZEXT1632(auVar88));
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar105,ZEXT1632(auVar87));
            fVar163 = auVar86._0_4_;
            fVar143 = auVar86._4_4_;
            fVar158 = auVar86._8_4_;
            fVar159 = auVar86._12_4_;
            local_500 = ZEXT1632(CONCAT412(auVar88._12_4_ * fVar159,
                                           CONCAT48(auVar88._8_4_ * fVar158,
                                                    CONCAT44(auVar88._4_4_ * fVar143,
                                                             auVar88._0_4_ * fVar163))));
            auVar197 = ZEXT3264(local_500);
            uVar160 = vcmpps_avx512vl(local_500,auVar211,2);
            uVar22 = vcmpps_avx512vl(local_500,local_480,0xd);
            bVar82 = (byte)uVar160 & (byte)uVar22 & bVar82;
            if (bVar82 != 0) {
              uVar83 = vcmpps_avx512vl(ZEXT1632(auVar89),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar83 = bVar82 & uVar83;
              if ((char)uVar83 != '\0') {
                fVar173 = auVar101._0_4_ * fVar163;
                fVar178 = auVar101._4_4_ * fVar143;
                auVar68._4_4_ = fVar178;
                auVar68._0_4_ = fVar173;
                fVar84 = auVar101._8_4_ * fVar158;
                auVar68._8_4_ = fVar84;
                fVar85 = auVar101._12_4_ * fVar159;
                auVar68._12_4_ = fVar85;
                fVar172 = auVar101._16_4_ * 0.0;
                auVar68._16_4_ = fVar172;
                fVar135 = auVar101._20_4_ * 0.0;
                auVar68._20_4_ = fVar135;
                fVar136 = auVar101._24_4_ * 0.0;
                auVar68._24_4_ = fVar136;
                auVar68._28_4_ = auVar101._28_4_;
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar98 = vsubps_avx(auVar171,auVar68);
                local_2c0._0_4_ =
                     (float)((uint)(bVar72 & 1) * (int)fVar173 |
                            (uint)!(bool)(bVar72 & 1) * auVar98._0_4_);
                bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar16 * (int)fVar178 | (uint)!bVar16 * auVar98._4_4_);
                bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar16 * (int)fVar84 | (uint)!bVar16 * auVar98._8_4_);
                bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar16 * (int)fVar85 | (uint)!bVar16 * auVar98._12_4_);
                bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar16 * (int)fVar172 | (uint)!bVar16 * auVar98._16_4_);
                bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar16 * (int)fVar135 | (uint)!bVar16 * auVar98._20_4_);
                bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar16 * (int)fVar136 | (uint)!bVar16 * auVar98._24_4_);
                bVar16 = SUB81(uVar73 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar98._28_4_);
                auVar98 = vsubps_avx(auVar102,auVar95);
                auVar86 = vfmadd213ps_fma(auVar98,local_2c0,auVar95);
                uVar144 = *(undefined4 *)((long)pre->ray_space + sVar81 * 4 + -0x10);
                auVar33._4_4_ = uVar144;
                auVar33._0_4_ = uVar144;
                auVar33._8_4_ = uVar144;
                auVar33._12_4_ = uVar144;
                auVar33._16_4_ = uVar144;
                auVar33._20_4_ = uVar144;
                auVar33._24_4_ = uVar144;
                auVar33._28_4_ = uVar144;
                auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                             CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                      CONCAT44(auVar86._4_4_ +
                                                                               auVar86._4_4_,
                                                                               auVar86._0_4_ +
                                                                               auVar86._0_4_)))),
                                          auVar33);
                uVar76 = vcmpps_avx512vl(local_500,auVar98,6);
                uVar83 = uVar83 & uVar76;
                bVar82 = (byte)uVar83;
                if (bVar82 != 0) {
                  auVar162._0_4_ = auVar103._0_4_ * fVar163;
                  auVar162._4_4_ = auVar103._4_4_ * fVar143;
                  auVar162._8_4_ = auVar103._8_4_ * fVar158;
                  auVar162._12_4_ = auVar103._12_4_ * fVar159;
                  auVar162._16_4_ = auVar103._16_4_ * 0.0;
                  auVar162._20_4_ = auVar103._20_4_ * 0.0;
                  auVar162._24_4_ = auVar103._24_4_ * 0.0;
                  auVar162._28_4_ = 0;
                  auVar177._8_4_ = 0x3f800000;
                  auVar177._0_8_ = 0x3f8000003f800000;
                  auVar177._12_4_ = 0x3f800000;
                  auVar177._16_4_ = 0x3f800000;
                  auVar177._20_4_ = 0x3f800000;
                  auVar177._24_4_ = 0x3f800000;
                  auVar177._28_4_ = 0x3f800000;
                  auVar98 = vsubps_avx(auVar177,auVar162);
                  auVar131._0_4_ =
                       (uint)(bVar72 & 1) * (int)auVar162._0_4_ |
                       (uint)!(bool)(bVar72 & 1) * auVar98._0_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
                  auVar131._4_4_ =
                       (uint)bVar16 * (int)auVar162._4_4_ | (uint)!bVar16 * auVar98._4_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                  auVar131._8_4_ =
                       (uint)bVar16 * (int)auVar162._8_4_ | (uint)!bVar16 * auVar98._8_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
                  auVar131._12_4_ =
                       (uint)bVar16 * (int)auVar162._12_4_ | (uint)!bVar16 * auVar98._12_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
                  auVar131._16_4_ =
                       (uint)bVar16 * (int)auVar162._16_4_ | (uint)!bVar16 * auVar98._16_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                  auVar131._20_4_ =
                       (uint)bVar16 * (int)auVar162._20_4_ | (uint)!bVar16 * auVar98._20_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                  auVar131._24_4_ =
                       (uint)bVar16 * (int)auVar162._24_4_ | (uint)!bVar16 * auVar98._24_4_;
                  auVar131._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar98._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar131,auVar177,auVar34);
                  local_280 = local_500;
                  local_260 = (int)lVar78;
                  local_25c = iVar77;
                  auVar196 = ZEXT1664(local_5d0);
                  local_250 = local_5d0;
                  local_240 = local_5a0._0_8_;
                  uStack_238 = local_5a0._8_8_;
                  local_230 = local_5b0._0_8_;
                  uStack_228 = local_5b0._8_8_;
                  local_220 = local_5c0;
                  uStack_218 = uStack_5b8;
                  pGVar13 = (context->scene->geometries).items[uVar79].ptr;
                  local_5e0._0_8_ = pGVar13;
                  if ((pGVar13->mask & *(uint *)(ray + sVar81 * 4 + 0x90)) != 0) {
                    auVar86 = vcvtsi2ss_avx512f(auVar92,(int)lVar78);
                    fVar163 = auVar86._0_4_;
                    local_200[0] = (fVar163 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar163 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar163 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar163 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar163 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar163 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar163 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar163 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_500;
                    auVar153._8_4_ = 0x7f800000;
                    auVar153._0_8_ = 0x7f8000007f800000;
                    auVar153._12_4_ = 0x7f800000;
                    auVar153._16_4_ = 0x7f800000;
                    auVar153._20_4_ = 0x7f800000;
                    auVar153._24_4_ = 0x7f800000;
                    auVar153._28_4_ = 0x7f800000;
                    auVar98 = vblendmps_avx512vl(auVar153,local_500);
                    auVar132._0_4_ =
                         (uint)(bVar82 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000
                    ;
                    bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                    auVar132._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
                    auVar132._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
                    auVar132._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                    auVar132._16_4_ = (uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar83 >> 5) & 1);
                    auVar132._20_4_ = (uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                    auVar132._24_4_ = (uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = SUB81(uVar83 >> 7,0);
                    auVar132._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar98 = vshufps_avx(auVar132,auVar132,0xb1);
                    auVar98 = vminps_avx(auVar132,auVar98);
                    auVar96 = vshufpd_avx(auVar98,auVar98,5);
                    auVar98 = vminps_avx(auVar98,auVar96);
                    auVar96 = vpermpd_avx2(auVar98,0x4e);
                    auVar98 = vminps_avx(auVar98,auVar96);
                    uVar160 = vcmpps_avx512vl(auVar132,auVar98,0);
                    uVar74 = (uint)uVar83;
                    if (((byte)uVar160 & bVar82) != 0) {
                      uVar74 = (uint)((byte)uVar160 & bVar82);
                    }
                    uVar75 = 0;
                    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                      uVar75 = uVar75 + 1;
                    }
                    uVar73 = (ulong)uVar75;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar213._0_32_);
                      local_5e4 = iVar77;
                      do {
                        fVar163 = local_200[uVar73];
                        local_420._4_4_ = fVar163;
                        local_420._0_4_ = fVar163;
                        local_420._8_4_ = fVar163;
                        local_420._12_4_ = fVar163;
                        local_410 = *(undefined4 *)(local_1e0 + uVar73 * 4);
                        *(undefined4 *)(ray + sVar81 * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar73 * 4);
                        local_590.context = context->user;
                        fVar143 = 1.0 - fVar163;
                        auVar26._8_4_ = 0x80000000;
                        auVar26._0_8_ = 0x8000000080000000;
                        auVar26._12_4_ = 0x80000000;
                        auVar88 = vxorps_avx512vl(ZEXT416((uint)fVar143),auVar26);
                        auVar86 = ZEXT416((uint)(fVar163 * fVar143 * 4.0));
                        auVar89 = vfnmsub213ss_fma(local_420,local_420,auVar86);
                        auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),
                                                  auVar86);
                        fVar143 = fVar143 * auVar88._0_4_ * 0.5;
                        fVar158 = auVar89._0_4_ * 0.5;
                        auVar192 = ZEXT464((uint)fVar158);
                        fVar159 = auVar86._0_4_ * 0.5;
                        fVar163 = fVar163 * fVar163 * 0.5;
                        auVar183._0_4_ = fVar163 * (float)local_5c0._0_4_;
                        auVar183._4_4_ = fVar163 * (float)local_5c0._4_4_;
                        auVar183._8_4_ = fVar163 * (float)uStack_5b8;
                        auVar183._12_4_ = fVar163 * uStack_5b8._4_4_;
                        auVar145._4_4_ = fVar159;
                        auVar145._0_4_ = fVar159;
                        auVar145._8_4_ = fVar159;
                        auVar145._12_4_ = fVar159;
                        auVar86 = vfmadd132ps_fma(auVar145,auVar183,local_5b0);
                        auVar184._4_4_ = fVar158;
                        auVar184._0_4_ = fVar158;
                        auVar184._8_4_ = fVar158;
                        auVar184._12_4_ = fVar158;
                        auVar86 = vfmadd132ps_fma(auVar184,auVar86,local_5a0);
                        auVar146._4_4_ = fVar143;
                        auVar146._0_4_ = fVar143;
                        auVar146._8_4_ = fVar143;
                        auVar146._12_4_ = fVar143;
                        auVar86 = vfmadd213ps_fma(auVar146,auVar196._0_16_,auVar86);
                        local_450 = auVar86._0_4_;
                        local_440 = vshufps_avx(auVar86,auVar86,0x55);
                        auVar191 = ZEXT1664(local_440);
                        local_430 = vshufps_avx(auVar86,auVar86,0xaa);
                        iStack_44c = local_450;
                        iStack_448 = local_450;
                        iStack_444 = local_450;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        local_400 = local_540._0_8_;
                        uStack_3f8 = local_540._8_8_;
                        local_3f0 = local_530;
                        vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                        uStack_3dc = (local_590.context)->instID[0];
                        local_3e0 = uStack_3dc;
                        uStack_3d8 = uStack_3dc;
                        uStack_3d4 = uStack_3dc;
                        uStack_3d0 = (local_590.context)->instPrimID[0];
                        uStack_3cc = uStack_3d0;
                        uStack_3c8 = uStack_3d0;
                        uStack_3c4 = uStack_3d0;
                        local_600 = local_490;
                        local_590.valid = (int *)local_600;
                        local_590.geometryUserPtr = *(void **)(local_5e0._0_8_ + 0x18);
                        local_590.hit = (RTCHitN *)&local_450;
                        local_590.N = 4;
                        local_4c0 = auVar212._0_32_;
                        local_560._0_4_ = (int)uVar83;
                        local_590.ray = (RTCRayN *)ray;
                        if (*(code **)(local_5e0._0_8_ + 0x40) != (code *)0x0) {
                          auVar191 = ZEXT1664(local_440);
                          auVar192 = ZEXT464((uint)fVar158);
                          (**(code **)(local_5e0._0_8_ + 0x40))(&local_590);
                          uVar83 = (ulong)(uint)local_560._0_4_;
                          auVar197 = ZEXT3264(local_500);
                          auVar212 = ZEXT3264(local_4c0);
                          auVar196 = ZEXT1664(local_5d0);
                        }
                        bVar82 = (byte)uVar83;
                        uVar83 = vptestmd_avx512vl(local_600,local_600);
                        if ((uVar83 & 0xf) == 0) {
LAB_01cba2c7:
                          *(int *)(ray + sVar81 * 4 + 0x80) = auVar212._0_4_;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_5e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar191 = ZEXT1664(auVar191._0_16_);
                            auVar192 = ZEXT1664(auVar192._0_16_);
                            (*p_Var14)(&local_590);
                            bVar82 = local_560[0];
                            auVar197 = ZEXT3264(local_500);
                            auVar212 = ZEXT3264(local_4c0);
                            auVar196 = ZEXT1664(local_5d0);
                          }
                          uVar83 = vptestmd_avx512vl(local_600,local_600);
                          uVar83 = uVar83 & 0xf;
                          bVar72 = (byte)uVar83;
                          if (bVar72 == 0) goto LAB_01cba2c7;
                          iVar77 = *(int *)(local_590.hit + 4);
                          iVar1 = *(int *)(local_590.hit + 8);
                          iVar2 = *(int *)(local_590.hit + 0xc);
                          bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar18 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_590.ray + 0xc0) =
                               (uint)(bVar72 & 1) * *(int *)local_590.hit |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_590.ray + 0xc0);
                          *(uint *)(local_590.ray + 0xc4) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0xc4);
                          *(uint *)(local_590.ray + 200) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 200);
                          *(uint *)(local_590.ray + 0xcc) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xcc)
                          ;
                          iVar77 = *(int *)(local_590.hit + 0x14);
                          iVar1 = *(int *)(local_590.hit + 0x18);
                          iVar2 = *(int *)(local_590.hit + 0x1c);
                          bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar18 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_590.ray + 0xd0) =
                               (uint)(bVar72 & 1) * *(int *)(local_590.hit + 0x10) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_590.ray + 0xd0);
                          *(uint *)(local_590.ray + 0xd4) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0xd4);
                          *(uint *)(local_590.ray + 0xd8) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd8)
                          ;
                          *(uint *)(local_590.ray + 0xdc) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xdc)
                          ;
                          iVar77 = *(int *)(local_590.hit + 0x24);
                          iVar1 = *(int *)(local_590.hit + 0x28);
                          iVar2 = *(int *)(local_590.hit + 0x2c);
                          bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar18 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_590.ray + 0xe0) =
                               (uint)(bVar72 & 1) * *(int *)(local_590.hit + 0x20) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_590.ray + 0xe0);
                          *(uint *)(local_590.ray + 0xe4) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0xe4);
                          *(uint *)(local_590.ray + 0xe8) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe8)
                          ;
                          *(uint *)(local_590.ray + 0xec) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xec)
                          ;
                          iVar77 = *(int *)(local_590.hit + 0x34);
                          iVar1 = *(int *)(local_590.hit + 0x38);
                          iVar2 = *(int *)(local_590.hit + 0x3c);
                          bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar18 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_590.ray + 0xf0) =
                               (uint)(bVar72 & 1) * *(int *)(local_590.hit + 0x30) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_590.ray + 0xf0);
                          *(uint *)(local_590.ray + 0xf4) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0xf4);
                          *(uint *)(local_590.ray + 0xf8) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf8)
                          ;
                          *(uint *)(local_590.ray + 0xfc) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xfc)
                          ;
                          iVar77 = *(int *)(local_590.hit + 0x44);
                          iVar1 = *(int *)(local_590.hit + 0x48);
                          iVar2 = *(int *)(local_590.hit + 0x4c);
                          bVar16 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar18 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_590.ray + 0x100) =
                               (uint)(bVar72 & 1) * *(int *)(local_590.hit + 0x40) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_590.ray + 0x100);
                          *(uint *)(local_590.ray + 0x104) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0x104);
                          *(uint *)(local_590.ray + 0x108) =
                               (uint)bVar17 * iVar1 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0x108);
                          *(uint *)(local_590.ray + 0x10c) =
                               (uint)bVar18 * iVar2 |
                               (uint)!bVar18 * *(int *)(local_590.ray + 0x10c);
                          auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar86;
                          auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar86;
                          auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar86;
                          auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar86;
                          auVar212 = ZEXT464(*(uint *)(ray + sVar81 * 4 + 0x80));
                        }
                        bVar82 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & bVar82;
                        uVar144 = auVar212._0_4_;
                        auVar154._4_4_ = uVar144;
                        auVar154._0_4_ = uVar144;
                        auVar154._8_4_ = uVar144;
                        auVar154._12_4_ = uVar144;
                        auVar154._16_4_ = uVar144;
                        auVar154._20_4_ = uVar144;
                        auVar154._24_4_ = uVar144;
                        auVar154._28_4_ = uVar144;
                        uVar160 = vcmpps_avx512vl(auVar197._0_32_,auVar154,2);
                        if ((bVar82 & (byte)uVar160) == 0) goto LAB_01cba357;
                        bVar82 = bVar82 & (byte)uVar160;
                        uVar83 = (ulong)bVar82;
                        auVar155._8_4_ = 0x7f800000;
                        auVar155._0_8_ = 0x7f8000007f800000;
                        auVar155._12_4_ = 0x7f800000;
                        auVar155._16_4_ = 0x7f800000;
                        auVar155._20_4_ = 0x7f800000;
                        auVar155._24_4_ = 0x7f800000;
                        auVar155._28_4_ = 0x7f800000;
                        auVar98 = vblendmps_avx512vl(auVar155,auVar197._0_32_);
                        auVar133._0_4_ =
                             (uint)(bVar82 & 1) * auVar98._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar82 >> 1 & 1);
                        auVar133._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar82 >> 2 & 1);
                        auVar133._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar82 >> 3 & 1);
                        auVar133._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        bVar16 = (bool)(bVar82 >> 4 & 1);
                        auVar133._16_4_ = (uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        bVar16 = (bool)(bVar82 >> 5 & 1);
                        auVar133._20_4_ = (uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        bVar16 = (bool)(bVar82 >> 6 & 1);
                        auVar133._24_4_ = (uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        auVar133._28_4_ =
                             (uint)(bVar82 >> 7) * auVar98._28_4_ |
                             (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                        auVar98 = vshufps_avx(auVar133,auVar133,0xb1);
                        auVar98 = vminps_avx(auVar133,auVar98);
                        auVar96 = vshufpd_avx(auVar98,auVar98,5);
                        auVar98 = vminps_avx(auVar98,auVar96);
                        auVar96 = vpermpd_avx2(auVar98,0x4e);
                        auVar98 = vminps_avx(auVar98,auVar96);
                        uVar160 = vcmpps_avx512vl(auVar133,auVar98,0);
                        bVar72 = (byte)uVar160 & bVar82;
                        if (bVar72 != 0) {
                          bVar82 = bVar72;
                        }
                        uVar74 = 0;
                        for (uVar75 = (uint)bVar82; (uVar75 & 1) == 0;
                            uVar75 = uVar75 >> 1 | 0x80000000) {
                          uVar74 = uVar74 + 1;
                        }
                        uVar73 = (ulong)uVar74;
                      } while( true );
                    }
                    fVar163 = local_200[uVar73];
                    uVar144 = *(undefined4 *)(local_1e0 + uVar73 * 4);
                    fVar143 = 1.0 - fVar163;
                    auVar25._8_4_ = 0x80000000;
                    auVar25._0_8_ = 0x8000000080000000;
                    auVar25._12_4_ = 0x80000000;
                    auVar88 = vxorps_avx512vl(ZEXT416((uint)fVar143),auVar25);
                    auVar86 = ZEXT416((uint)(fVar163 * fVar143 * 4.0));
                    auVar89 = vfnmsub213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar86
                                              );
                    auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),auVar86)
                    ;
                    fVar143 = fVar143 * auVar88._0_4_ * 0.5;
                    fVar158 = auVar89._0_4_ * 0.5;
                    auVar192 = ZEXT464((uint)fVar158);
                    fVar159 = auVar86._0_4_ * 0.5;
                    fVar173 = fVar163 * fVar163 * 0.5;
                    auVar181._0_4_ = fVar173 * (float)local_5c0._0_4_;
                    auVar181._4_4_ = fVar173 * (float)local_5c0._4_4_;
                    auVar181._8_4_ = fVar173 * (float)uStack_5b8;
                    auVar181._12_4_ = fVar173 * uStack_5b8._4_4_;
                    auVar167._4_4_ = fVar159;
                    auVar167._0_4_ = fVar159;
                    auVar167._8_4_ = fVar159;
                    auVar167._12_4_ = fVar159;
                    auVar86 = vfmadd132ps_fma(auVar167,auVar181,local_5b0);
                    auVar182._4_4_ = fVar158;
                    auVar182._0_4_ = fVar158;
                    auVar182._8_4_ = fVar158;
                    auVar182._12_4_ = fVar158;
                    auVar86 = vfmadd132ps_fma(auVar182,auVar86,local_5a0);
                    auVar191 = ZEXT1664(auVar86);
                    auVar168._4_4_ = fVar143;
                    auVar168._0_4_ = fVar143;
                    auVar168._8_4_ = fVar143;
                    auVar168._12_4_ = fVar143;
                    auVar86 = vfmadd213ps_fma(auVar168,local_5d0,auVar86);
                    *(undefined4 *)(ray + sVar81 * 4 + 0x80) =
                         *(undefined4 *)(local_1c0 + uVar73 * 4);
                    *(int *)(ray + sVar81 * 4 + 0xc0) = auVar86._0_4_;
                    uVar12 = vextractps_avx(auVar86,1);
                    *(undefined4 *)(ray + sVar81 * 4 + 0xd0) = uVar12;
                    uVar12 = vextractps_avx(auVar86,2);
                    *(undefined4 *)(ray + sVar81 * 4 + 0xe0) = uVar12;
                    *(float *)(ray + sVar81 * 4 + 0xf0) = fVar163;
                    *(undefined4 *)(ray + sVar81 * 4 + 0x100) = uVar144;
                    *(undefined4 *)(ray + sVar81 * 4 + 0x110) = uVar3;
                    *(uint *)(ray + sVar81 * 4 + 0x120) = uVar79;
                    *(uint *)(ray + sVar81 * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + sVar81 * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01cb9fb1;
      }
LAB_01cb961d:
      uVar3 = *(undefined4 *)(ray + sVar81 * 4 + 0x80);
      auVar31._4_4_ = uVar3;
      auVar31._0_4_ = uVar3;
      auVar31._8_4_ = uVar3;
      auVar31._12_4_ = uVar3;
      auVar31._16_4_ = uVar3;
      auVar31._20_4_ = uVar3;
      auVar31._24_4_ = uVar3;
      auVar31._28_4_ = uVar3;
      uVar160 = vcmpps_avx512vl(local_80,auVar31,2);
      uVar79 = (uint)uVar80 & (uint)uVar160;
      uVar80 = (ulong)uVar79;
    } while (uVar79 != 0);
  }
  return;
LAB_01cba357:
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar214 = ZEXT3264(auVar98);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar215 = ZEXT1664(auVar86);
  auVar216 = ZEXT464(0x35000000);
  auVar98 = vmovdqa64_avx512vl(local_140);
  auVar213 = ZEXT3264(auVar98);
  iVar77 = local_5e4;
LAB_01cb9fb1:
  lVar78 = lVar78 + 8;
  if (iVar77 <= (int)lVar78) goto LAB_01cb961d;
  goto LAB_01cb96be;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }